

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void mbedtls_strerror(int ret,char *buf,size_t buflen)

{
  uint uVar1;
  size_t sVar2;
  char *__format;
  char *pcVar3;
  char *__format_00;
  short sVar4;
  uint uVar5;
  uint uVar6;
  size_t local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  
  if (buflen == 0) {
    brainpoolP512r1_gy[5]._1_1_ = 0x7b;
    return;
  }
  memset(buf,0,buflen);
  uVar6 = -ret;
  if (0 < ret) {
    uVar6 = ret;
  }
  uVar5 = uVar6 & 0xff80;
  if ((uVar6 & 0xff80) == 0) goto LAB_00135872;
  sVar4 = (short)uVar5;
  if (uVar5 == 0x1080) {
    pcVar3 = "PEM - No PEM header or footer found";
LAB_00132ae4:
    snprintf(buf,buflen,pcVar3);
LAB_00132af5:
    switch(uVar5 - 0x7200 >> 7) {
    case 0:
switchD_00132b17_caseD_0:
      snprintf(buf,buflen,"SSL - An invalid SSL record was received");
LAB_00132b31:
      switch(uVar5 - 0x6880 >> 7) {
      case 0:
        goto switchD_00132b8f_caseD_1;
      case 1:
        goto switchD_00132b8f_caseD_2;
      case 2:
        goto switchD_00132b8f_caseD_3;
      case 3:
        goto switchD_00132b8f_caseD_4;
      case 4:
        goto switchD_00132b8f_caseD_5;
      case 5:
        goto switchD_00132b8f_caseD_6;
      case 6:
        goto switchD_00132b8f_caseD_7;
      case 7:
        goto switchD_00132b8f_caseD_8;
      case 8:
        goto switchD_00132b8f_caseD_9;
      case 9:
        goto switchD_00132b8f_caseD_a;
      case 10:
        goto switchD_00132b8f_caseD_b;
      case 0xb:
        goto switchD_00132b8f_caseD_c;
      case 0xc:
        goto switchD_00132b8f_caseD_d;
      case 0xd:
        goto switchD_00132b8f_caseD_e;
      case 0xe:
        goto switchD_00132b8f_caseD_f;
      case 0x14:
        goto switchD_00132b53_caseD_14;
      case 0x15:
        goto switchD_00132b8f_caseD_16;
      case 0x16:
        goto switchD_00132b8f_caseD_17;
      case 0x17:
        goto switchD_00132b8f_caseD_18;
      case 0x18:
        goto switchD_00132b8f_caseD_19;
      case 0x19:
        goto switchD_00132b8f_caseD_1a;
      case 0x1a:
        goto switchD_00132b8f_caseD_1b;
      case 0x1b:
        goto switchD_00132b8f_caseD_1c;
      case 0x1c:
        goto switchD_00132b8f_caseD_1d;
      case 0x1d:
        goto switchD_00132b8f_caseD_1e;
      case 0x1e:
        goto switchD_00132b8f_caseD_1f;
      case 0x1f:
        goto switchD_00132b8f_caseD_20;
      case 0x20:
        goto switchD_00132b8f_caseD_21;
      case 0x21:
        goto switchD_00132b8f_caseD_22;
      case 0x22:
        goto switchD_00132b8f_caseD_23;
      case 0x23:
        goto switchD_00132b8f_caseD_24;
      case 0x24:
        goto switchD_00132b8f_caseD_25;
      case 0x25:
        goto switchD_00132b8f_caseD_26;
      case 0x26:
        goto switchD_00132b8f_caseD_27;
      case 0x27:
        goto switchD_00132b8f_caseD_28;
      case 0x28:
        goto switchD_00132b8f_caseD_29;
      case 0x29:
        goto switchD_00132b8f_caseD_2a;
      case 0x2a:
        goto switchD_00132b8f_caseD_2b;
      case 0x2b:
        goto switchD_00132b8f_caseD_2c;
      case 0x2c:
        goto switchD_00132b8f_caseD_2d;
      case 0x2d:
        goto switchD_00132b8f_caseD_2e;
      case 0x2e:
        goto switchD_00132b8f_caseD_2f;
      }
      break;
    case 1:
switchD_00132b53_caseD_14:
      snprintf(buf,buflen,"SSL - The connection indicated an EOF");
      goto LAB_00132b6d;
    case 2:
      goto switchD_00132b8f_caseD_16;
    case 3:
      goto switchD_00132b8f_caseD_17;
    case 4:
      goto switchD_00132b8f_caseD_18;
    case 5:
      goto switchD_00132b8f_caseD_19;
    case 6:
      goto switchD_00132b8f_caseD_1a;
    case 7:
      goto switchD_00132b8f_caseD_1b;
    case 8:
      goto switchD_00132b8f_caseD_1c;
    case 9:
      goto switchD_00132b8f_caseD_1d;
    case 10:
      goto switchD_00132b8f_caseD_1e;
    case 0xb:
      goto switchD_00132b8f_caseD_1f;
    case 0xc:
      goto switchD_00132b8f_caseD_20;
    case 0xd:
      goto switchD_00132b8f_caseD_21;
    case 0xe:
      goto switchD_00132b8f_caseD_22;
    case 0xf:
      goto switchD_00132b8f_caseD_23;
    case 0x10:
      goto switchD_00132b8f_caseD_24;
    case 0x11:
      goto switchD_00132b8f_caseD_25;
    case 0x12:
      goto switchD_00132b8f_caseD_26;
    case 0x13:
      goto switchD_00132b8f_caseD_27;
    case 0x14:
      goto switchD_00132b8f_caseD_28;
    case 0x15:
      goto switchD_00132b8f_caseD_29;
    case 0x16:
      goto switchD_00132b8f_caseD_2a;
    case 0x17:
      goto switchD_00132b8f_caseD_2b;
    case 0x18:
      goto switchD_00132b8f_caseD_2c;
    default:
      goto switchD_00132b17_default;
    }
    goto switchD_00134acd_default;
  }
  local_40 = "RSA - Input data contains invalid padding and is rejected";
  local_50 = "RSA - Bad input parameters to function";
  local_48 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
  pcVar3 = "PEM - PEM string is not as expected";
  if (uVar5 == 0x1100) {
LAB_00132084:
    snprintf(buf,buflen,pcVar3);
    if (sVar4 == 0x1e00) {
switchD_001323d7_caseD_0:
      pcVar3 = "PKCS12 - Given private key password does not allow for correct decryption";
      goto LAB_00135838;
    }
    if (uVar5 == 0x1e80) goto switchD_001323d7_caseD_1;
    if (uVar5 == 0x1f00) goto switchD_001323d7_caseD_2;
    if (uVar5 == 0x1f80) goto switchD_001323d7_caseD_3;
    if (uVar5 == 0x2e00) goto switchD_001323d7_caseD_20;
    if (uVar5 == 0x2e80) goto switchD_001323d7_caseD_21;
    if (uVar5 == 0x2f00) goto switchD_001323d7_caseD_22;
    if (uVar5 == 0x2f80) goto switchD_001323d7_caseD_23;
    if (uVar5 == 0x3900) goto switchD_00131ddf_caseD_0;
    if (uVar5 == 0x3980) goto switchD_00131ddf_caseD_1;
    if (uVar5 == 0x3a00) goto switchD_00131ddf_caseD_2;
    if (uVar5 == 0x3a80) goto switchD_00131ddf_caseD_3;
    if (uVar5 == 0x3b00) goto switchD_00131ddf_caseD_4;
    if (uVar5 == 0x3b80) goto switchD_00131ddf_caseD_5;
    if (uVar5 == 0x3c00) goto switchD_00131ddf_caseD_6;
    if (uVar5 == 0x3c80) goto switchD_00131ddf_caseD_7;
    if (uVar5 == 0x3d00) goto switchD_00131ddf_caseD_8;
    if (uVar5 == 0x3d80) goto switchD_00131ddf_caseD_9;
    if (uVar5 == 0x3e00) {
switchD_00131ddf_caseD_a:
      pcVar3 = "PK - Read/write of file failed";
      goto LAB_0013239d;
    }
    if (uVar5 == 0x4480) goto switchD_00132acf_caseD_8;
    if (uVar5 == 0x4080) goto switchD_00132acf_caseD_0;
    if (uVar5 == 0x4100) goto switchD_00132acf_caseD_1;
    if (uVar5 == 0x4180) goto switchD_00132acf_caseD_2;
    if (uVar5 == 0x4200) goto switchD_00132acf_caseD_3;
    if (uVar5 == 0x4280) goto switchD_00132acf_caseD_4;
    if (uVar5 == 0x4300) goto switchD_00132acf_caseD_5;
    if (uVar5 == 0x4380) goto switchD_00132acf_caseD_6;
    if (uVar5 == 0x4400) goto switchD_00132acf_caseD_7;
    if (uVar5 == 16000) {
switchD_00131ddf_caseD_b:
      pcVar3 = "PK - Bad input parameters to function";
      goto LAB_00132217;
    }
    goto LAB_00132af5;
  }
  if (uVar5 == 0x1180) {
    pcVar3 = "PEM - Failed to allocate memory";
    goto LAB_00132084;
  }
  pcVar3 = "PEM - RSA IV is not in hex-format";
  if (uVar5 == 0x1200) {
LAB_00132217:
    snprintf(buf,buflen,pcVar3);
    if (sVar4 == 0x1e00) goto switchD_001323d7_caseD_0;
    if (uVar5 != 0x1e80) {
      if (uVar5 == 0x1f00) goto switchD_001323d7_caseD_2;
      if (uVar5 == 0x1f80) goto switchD_001323d7_caseD_3;
      if (uVar5 == 0x2e00) goto switchD_001323d7_caseD_20;
      if (uVar5 == 0x2e80) goto switchD_001323d7_caseD_21;
      if (uVar5 == 0x2f00) goto switchD_001323d7_caseD_22;
      if (uVar5 == 0x2f80) goto switchD_001323d7_caseD_23;
      if (uVar5 == 0x3900) goto switchD_00131ddf_caseD_0;
      if (uVar5 == 0x3980) goto switchD_00131ddf_caseD_1;
      if (uVar5 == 0x3a00) goto switchD_00131ddf_caseD_2;
      if (uVar5 == 0x3a80) goto switchD_00131ddf_caseD_3;
      if (uVar5 == 0x3b00) goto switchD_00131ddf_caseD_4;
      if (uVar5 == 0x3b80) goto switchD_00131ddf_caseD_5;
      if (uVar5 == 0x3c00) goto switchD_00131ddf_caseD_6;
      if (uVar5 == 0x3c80) goto switchD_00131ddf_caseD_7;
      if (uVar5 == 0x3d00) goto switchD_00131ddf_caseD_8;
      if (uVar5 == 0x3d80) goto switchD_00131ddf_caseD_9;
      if (uVar5 == 0x4480) goto switchD_00132acf_caseD_8;
      if (uVar5 == 0x4080) goto switchD_00132acf_caseD_0;
      if (uVar5 == 0x4100) goto switchD_00132acf_caseD_1;
      if (uVar5 == 0x4180) goto switchD_00132acf_caseD_2;
      if (uVar5 == 0x4200) goto switchD_00132acf_caseD_3;
      if (uVar5 == 0x4280) goto switchD_00132acf_caseD_4;
      if (uVar5 == 0x4300) goto switchD_00132acf_caseD_5;
      if (uVar5 == 0x4380) goto switchD_00132acf_caseD_6;
      if (uVar5 == 0x4400) goto switchD_00132acf_caseD_7;
      if (uVar5 == 0x3e00) goto switchD_00131ddf_caseD_a;
      goto LAB_00132b31;
    }
switchD_001323d7_caseD_1:
    pcVar3 = "PKCS12 - PBE ASN.1 data not as expected";
    goto LAB_00135777;
  }
  if (uVar5 == 0x1280) {
    pcVar3 = "PEM - Unsupported key encryption algorithm";
    goto LAB_00132217;
  }
  pcVar3 = "PEM - Private key password can\'t be empty";
  if (uVar5 != 0x1300) {
    if (uVar5 == 0x1380) {
      pcVar3 = "PEM - Given private key password does not allow for correct decryption";
      goto LAB_00132c28;
    }
    if (uVar5 == 0x1400) {
      pcVar3 = "PEM - Unavailable feature, e.g. hashing/encryption combination";
      goto LAB_001323ec;
    }
    if (uVar5 == 0x1480) {
      pcVar3 = "PEM - Bad input parameters to function";
LAB_001329d0:
      snprintf(buf,buflen,pcVar3);
LAB_001329e1:
      switch(uVar5 - 0x6a00 >> 7) {
      case 0:
        goto switchD_00132b8f_caseD_4;
      case 1:
        goto switchD_00132b8f_caseD_5;
      case 2:
        goto switchD_00132b8f_caseD_6;
      case 3:
        goto switchD_00132b8f_caseD_7;
      case 4:
        goto switchD_00132b8f_caseD_8;
      case 5:
        goto switchD_00132b8f_caseD_9;
      case 6:
        goto switchD_00132b8f_caseD_a;
      case 7:
        goto switchD_00132b8f_caseD_b;
      case 8:
        goto switchD_00132b8f_caseD_c;
      case 9:
        goto switchD_00132b8f_caseD_d;
      case 10:
        goto switchD_00132b8f_caseD_e;
      case 0xb:
        goto switchD_00132b8f_caseD_f;
      case 0xe:
switchD_00132a03_caseD_e:
        snprintf(buf,buflen,"SSL - Bad input parameters to function");
        uVar1 = uVar5 - 0x7180 >> 7;
        if (uVar1 < 5) {
          (*(code *)(&DAT_00155b4c + *(int *)(&DAT_00155b4c + (ulong)uVar1 * 4)))();
          return;
        }
        goto LAB_00132be5;
      case 0xf:
switchD_00132a03_caseD_f:
        pcVar3 = "SSL - Verification of the message MAC failed";
        goto LAB_00132ae4;
      case 0x10:
        goto switchD_00132b17_caseD_0;
      case 0x11:
        goto switchD_00132b53_caseD_14;
      case 0x12:
        goto switchD_00132b8f_caseD_16;
      case 0x13:
        goto switchD_00132b8f_caseD_17;
      case 0x14:
        goto switchD_00132b8f_caseD_18;
      case 0x15:
        goto switchD_00132b8f_caseD_19;
      case 0x16:
        goto switchD_00132b8f_caseD_1a;
      case 0x17:
        goto switchD_00132b8f_caseD_1b;
      case 0x18:
        goto switchD_00132b8f_caseD_1c;
      case 0x19:
        goto switchD_00132b8f_caseD_1d;
      case 0x1a:
        goto switchD_00132b8f_caseD_1e;
      case 0x1b:
        goto switchD_00132b8f_caseD_1f;
      case 0x1c:
        goto switchD_00132b8f_caseD_20;
      case 0x1d:
        goto switchD_00132b8f_caseD_21;
      case 0x1e:
        goto switchD_00132b8f_caseD_22;
      case 0x1f:
        goto switchD_00132b8f_caseD_23;
      case 0x20:
        goto switchD_00132b8f_caseD_24;
      case 0x21:
        goto switchD_00132b8f_caseD_25;
      case 0x22:
        goto switchD_00132b8f_caseD_26;
      case 0x23:
        goto switchD_00132b8f_caseD_27;
      case 0x24:
        goto switchD_00132b8f_caseD_28;
      case 0x25:
        goto switchD_00132b8f_caseD_29;
      case 0x26:
        goto switchD_00132b8f_caseD_2a;
      case 0x27:
        goto switchD_00132b8f_caseD_2b;
      case 0x28:
        goto switchD_00132b8f_caseD_2c;
      case 0x29:
        goto switchD_00132b8f_caseD_2d;
      case 0x2a:
        goto switchD_00132b8f_caseD_2e;
      case 0x2b:
        goto switchD_00132b8f_caseD_2f;
      }
      goto switchD_00132a03_caseD_c;
    }
    if (uVar5 == 0x1e00) goto switchD_001323d7_caseD_0;
    if (uVar5 == 0x1e80) goto switchD_001323d7_caseD_1;
    if (uVar5 == 0x1f00) goto switchD_001323d7_caseD_2;
    if (uVar5 == 0x1f80) goto switchD_001323d7_caseD_3;
    if (uVar5 == 0x2e00) goto switchD_001323d7_caseD_20;
    if (uVar5 == 0x2e80) goto switchD_001323d7_caseD_21;
    if (uVar5 == 0x2f00) goto switchD_001323d7_caseD_22;
    if (uVar5 == 0x2f80) goto switchD_001323d7_caseD_23;
    if (uVar5 == 0x3080) {
      pcVar3 = "DHM - Bad input parameters to function";
      goto LAB_001356c3;
    }
    if (uVar5 == 0x3100) {
      pcVar3 = "DHM - Reading of the DHM parameters failed";
      goto LAB_00132b98;
    }
    if (uVar5 == 0x3180) {
      pcVar3 = "DHM - Making of the DHM parameters failed";
      goto LAB_00132b98;
    }
    if (uVar5 == 0x3200) {
      pcVar3 = "DHM - Reading of the public values failed";
      goto LAB_00132b98;
    }
    if (uVar5 == 0x3280) {
      pcVar3 = "DHM - Making of the public value failed";
      goto LAB_00132b98;
    }
    if (uVar5 == 0x3300) {
      pcVar3 = "DHM - Calculation of the DHM secret failed";
      goto LAB_001356c3;
    }
    if (uVar5 == 0x3380) {
      pcVar3 = "DHM - The ASN.1 data is not formatted correctly";
      goto LAB_001356c3;
    }
    if (uVar5 == 0x3400) {
      pcVar3 = "DHM - Allocation of memory failed";
      goto LAB_001356ff;
    }
    __format = "ECP - Invalid private or public key";
    __format_00 = "ECP - Generation of random value, such as (ephemeral) key, failed";
    pcVar3 = "ECP - Memory allocation failed";
    if (uVar5 != 0x3480) {
      if (uVar5 == 0x3900) goto switchD_00131ddf_caseD_0;
      if (uVar5 == 0x3980) goto switchD_00131ddf_caseD_1;
      if (uVar5 == 0x3a00) goto switchD_00131ddf_caseD_2;
      if (uVar5 == 0x3a80) goto switchD_00131ddf_caseD_3;
      if (uVar5 == 0x3b00) goto switchD_00131ddf_caseD_4;
      if (uVar5 == 0x3b80) goto switchD_00131ddf_caseD_5;
      if (uVar5 == 0x3c00) goto switchD_00131ddf_caseD_6;
      if (uVar5 == 0x3c80) goto switchD_00131ddf_caseD_7;
      if (uVar5 == 0x3d00) goto switchD_00131ddf_caseD_8;
      if (uVar5 == 0x3d80) goto switchD_00131ddf_caseD_9;
      if (uVar5 == 0x3e00) goto switchD_00131ddf_caseD_a;
      if (uVar5 == 16000) goto switchD_00131ddf_caseD_b;
      if (uVar5 == 0x3f00) {
switchD_00131ddf_caseD_c:
        pcVar3 = "PK - Type mismatch, eg attempt to encrypt with an ECDSA key";
        goto LAB_00132084;
      }
      if (uVar5 == 0x3f80) {
switchD_00131ddf_caseD_d:
        snprintf(buf,buflen,"PK - Memory allocation failed");
        switch(uVar5 - 0x3c80 >> 7) {
        case 0:
          goto switchD_00131ddf_caseD_7;
        case 1:
          goto switchD_00131ddf_caseD_8;
        case 2:
          goto switchD_00131ddf_caseD_9;
        case 3:
          goto switchD_00131ddf_caseD_a;
        case 4:
          goto switchD_00131ddf_caseD_b;
        case 5:
          goto switchD_00131ddf_caseD_c;
        }
        goto switchD_0013207b_default;
      }
      if (uVar5 == 0x4080) goto switchD_00132acf_caseD_0;
      if (uVar5 == 0x4100) goto switchD_00132acf_caseD_1;
      if (uVar5 == 0x4180) goto switchD_00132acf_caseD_2;
      if (uVar5 == 0x4200) goto switchD_00132acf_caseD_3;
      if (uVar5 == 0x4c00) {
        snprintf(buf,buflen,"ECP - Signature is valid but shorter than the user-supplied length");
        goto LAB_00131d45;
      }
      if (uVar5 == 0x4c80) goto LAB_001325da;
      if (uVar5 == 0x4d00) goto LAB_0013259b;
      if (uVar5 == 0x4d80) goto LAB_001323ec;
      if (uVar5 == 0x4e00) {
        snprintf(buf,buflen,"ECP - The signature is not valid");
LAB_00131dbd:
        switch(uVar5 - 0x3900 >> 7) {
        case 0:
          goto switchD_00131ddf_caseD_0;
        case 1:
          goto switchD_00131ddf_caseD_1;
        case 2:
          goto switchD_00131ddf_caseD_2;
        case 3:
          goto switchD_00131ddf_caseD_3;
        case 4:
          goto switchD_00131ddf_caseD_4;
        case 5:
          goto switchD_00131ddf_caseD_5;
        case 6:
          goto switchD_00131ddf_caseD_6;
        case 7:
          goto switchD_00131ddf_caseD_7;
        case 8:
          goto switchD_00131ddf_caseD_8;
        case 9:
          goto switchD_00131ddf_caseD_9;
        case 10:
          goto switchD_00131ddf_caseD_a;
        case 0xb:
          goto switchD_00131ddf_caseD_b;
        case 0xc:
          goto switchD_00131ddf_caseD_c;
        case 0xd:
          goto switchD_00131ddf_caseD_d;
        }
        switch(uVar5 - 0x4080 >> 7) {
        case 0:
          goto switchD_00132acf_caseD_0;
        case 1:
          goto switchD_00132acf_caseD_1;
        case 2:
          goto switchD_00132acf_caseD_2;
        case 3:
          goto switchD_00132acf_caseD_3;
        case 4:
          goto switchD_00132acf_caseD_4;
        case 5:
          goto switchD_00132acf_caseD_5;
        case 6:
          goto switchD_00132acf_caseD_6;
        case 7:
          goto switchD_00132acf_caseD_7;
        case 8:
          goto switchD_00132acf_caseD_8;
        }
        goto switchD_00132acf_default;
      }
      if (uVar5 == 0x4e80) {
        snprintf(buf,buflen,"ECP - Requested curve not available");
LAB_00131d81:
        switch(uVar5 - 0x3900 >> 7) {
        case 0:
          goto switchD_00131ddf_caseD_0;
        case 1:
          goto switchD_00131ddf_caseD_1;
        case 2:
          goto switchD_00131ddf_caseD_2;
        case 3:
          goto switchD_00131ddf_caseD_3;
        case 4:
          goto switchD_00131ddf_caseD_4;
        case 5:
          goto switchD_00131ddf_caseD_5;
        case 6:
          goto switchD_00131ddf_caseD_6;
        case 7:
          goto switchD_00131ddf_caseD_7;
        case 8:
          goto switchD_00131ddf_caseD_8;
        case 9:
          goto switchD_00131ddf_caseD_9;
        case 10:
          goto switchD_00131ddf_caseD_a;
        case 0xb:
          goto switchD_00131ddf_caseD_b;
        case 0xc:
          goto switchD_00131ddf_caseD_c;
        case 0xd:
          goto switchD_00131ddf_caseD_d;
        case 0xf:
          goto switchD_00132acf_caseD_0;
        case 0x10:
          goto switchD_00132acf_caseD_1;
        case 0x11:
          goto switchD_00132acf_caseD_2;
        case 0x12:
          goto switchD_00132acf_caseD_3;
        case 0x13:
          goto switchD_00132acf_caseD_4;
        case 0x14:
          goto switchD_00132acf_caseD_5;
        case 0x15:
          goto switchD_00132acf_caseD_6;
        case 0x16:
          goto switchD_00132acf_caseD_7;
        }
        goto switchD_00131da3_caseD_e;
      }
      if (uVar5 == 0x4f00) {
        snprintf(buf,buflen,"ECP - The buffer is too small to write to");
LAB_00131d45:
        switch(uVar5 - 0x3a00 >> 7) {
        case 0:
          goto switchD_00131ddf_caseD_2;
        case 1:
          goto switchD_00131ddf_caseD_3;
        case 2:
          goto switchD_00131ddf_caseD_4;
        case 3:
          goto switchD_00131ddf_caseD_5;
        case 4:
          goto switchD_00131ddf_caseD_6;
        case 5:
          goto switchD_00131ddf_caseD_7;
        case 6:
          goto switchD_00131ddf_caseD_8;
        case 7:
          goto switchD_00131ddf_caseD_9;
        case 8:
          goto switchD_00131ddf_caseD_a;
        case 9:
          goto switchD_00131ddf_caseD_b;
        case 10:
          goto switchD_00131ddf_caseD_c;
        case 0xb:
          goto switchD_00131ddf_caseD_d;
        }
        goto switchD_00131d67_default;
      }
      if (uVar5 == 0x4f80) {
        snprintf(buf,buflen,"ECP - Bad input parameters to function");
        goto LAB_00131d45;
      }
      if (uVar5 == 0x5080) {
        snprintf(buf,buflen,"MD - The selected feature is not available");
        goto LAB_00131d81;
      }
      if (uVar5 == 0x5100) {
        snprintf(buf,buflen,"MD - Bad input parameters to function");
        goto LAB_00131dbd;
      }
      if (uVar5 == 0x5180) {
        pcVar3 = "MD - Failed to allocate memory";
        goto LAB_001329d0;
      }
      if (uVar5 == 0x5200) {
        snprintf(buf,buflen,"MD - Opening or reading of file failed");
        goto LAB_001329e1;
      }
      if (uVar5 == 0x6080) {
        pcVar3 = "CIPHER - The selected feature is not available";
        goto LAB_00135838;
      }
      if (uVar5 == 0x6100) {
        pcVar3 = "CIPHER - Bad input parameters to function";
        goto LAB_0013265e;
      }
      if (uVar5 == 0x6180) {
        pcVar3 = "CIPHER - Failed to allocate memory";
        goto LAB_00132c28;
      }
      if (uVar5 == 0x6200) {
        pcVar3 = "CIPHER - Input data contains invalid padding and is rejected";
        goto LAB_00132ae4;
      }
      if (uVar5 == 0x6380) {
        pcVar3 = "CIPHER - The context is invalid, eg because it was free()ed";
        goto LAB_001356ff;
      }
      if (uVar5 != 0x6300) {
        if (uVar5 == 0x6280) {
          pcVar3 = "CIPHER - Decryption of block requires a full block";
          goto LAB_00135838;
        }
        goto LAB_00132747;
      }
      pcVar3 = "CIPHER - Authentication failed (for AEAD modes)";
      goto LAB_001354e3;
    }
    snprintf(buf,buflen,"DHM - Read/write of file failed");
    goto LAB_00135710;
  }
LAB_0013239d:
  snprintf(buf,buflen,pcVar3);
  switch((uVar5 - 0x1e00 & 0xffff) >> 7) {
  case 0:
    goto switchD_001323d7_caseD_0;
  case 1:
    goto switchD_001323d7_caseD_1;
  case 2:
switchD_001323d7_caseD_2:
    pcVar3 = "PKCS12 - Feature not available, e.g. unsupported encryption scheme";
    break;
  case 3:
switchD_001323d7_caseD_3:
    pcVar3 = "PKCS12 - Bad input parameters to function";
    break;
  default:
    goto switchD_0013549e_default;
  case 5:
    goto switchD_00135426_caseD_0;
  case 6:
    goto switchD_00135426_caseD_1;
  case 7:
    goto switchD_00135426_caseD_2;
  case 8:
    goto switchD_00135426_caseD_3;
  case 9:
    goto switchD_00135426_caseD_4;
  case 10:
    goto switchD_00135426_caseD_5;
  case 0x20:
switchD_001323d7_caseD_20:
    snprintf(buf,buflen,"PKCS5 - Given private key password does not allow for correct decryption");
    uVar1 = uVar5 - 0x4080 >> 7;
    if (uVar1 < 5) {
      (*(code *)(&DAT_00155924 + *(int *)(&DAT_00155924 + (ulong)uVar1 * 4)))();
      return;
    }
    goto switchD_00135426_default;
  case 0x21:
switchD_001323d7_caseD_21:
    pcVar3 = "PKCS5 - Requested encryption or digest alg not available";
    break;
  case 0x22:
switchD_001323d7_caseD_22:
    pcVar3 = "PKCS5 - Unexpected ASN.1 data";
    goto LAB_001356c3;
  case 0x23:
switchD_001323d7_caseD_23:
    pcVar3 = "PKCS5 - Bad input parameters to function";
    break;
  case 0x36:
switchD_00131ddf_caseD_0:
    pcVar3 = "PK - The signature is valid but its length is less than expected";
LAB_001356c3:
    snprintf(buf,buflen,pcVar3);
LAB_001356d4:
    switch(uVar5 - 0x2680 >> 7) {
    case 0:
switchD_00135426_caseD_c:
      pcVar3 = "X509 - Signature algorithms do not match. (see \\c ::mbedtls_x509_crt sig_oid)";
LAB_001356ff:
      snprintf(buf,buflen,pcVar3);
LAB_00135710:
      switch(uVar5 - 0x2700 >> 7) {
      case 0:
        goto switchD_00135426_caseD_d;
      case 1:
        goto switchD_00135426_caseD_e;
      case 2:
        goto switchD_00135426_caseD_f;
      case 3:
        goto switchD_00135426_caseD_10;
      case 4:
        goto switchD_00135426_caseD_11;
      case 5:
        goto switchD_00135426_caseD_12;
      }
      break;
    case 1:
switchD_00135426_caseD_d:
      snprintf(buf,buflen,
               "X509 - Certificate verification failed, e.g. CRL, CA or signature check failed");
LAB_0013574c:
      switch(uVar5 - 0x2780 >> 7) {
      case 0:
        goto switchD_00135426_caseD_e;
      case 1:
        goto switchD_00135426_caseD_f;
      case 2:
        goto switchD_00135426_caseD_10;
      case 3:
        goto switchD_00135426_caseD_11;
      case 4:
        goto switchD_00135426_caseD_12;
      }
      break;
    case 2:
switchD_00135426_caseD_e:
      pcVar3 = "X509 - Format not recognized as DER or PEM";
LAB_00135777:
      snprintf(buf,buflen,pcVar3);
LAB_00135788:
      switch(uVar5 - 0x2800 >> 7) {
      case 0:
        goto switchD_00135426_caseD_f;
      case 1:
        goto switchD_00135426_caseD_10;
      case 2:
        goto switchD_00135426_caseD_11;
      case 3:
        goto switchD_00135426_caseD_12;
      }
      break;
    case 3:
switchD_00135426_caseD_f:
      snprintf(buf,buflen,"X509 - Input invalid");
      if (sVar4 == 0x2980) goto switchD_00135426_caseD_12;
      if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
      if (uVar5 == 0x2880) {
LAB_001357de:
        pcVar3 = "X509 - Allocation of memory failed";
        goto LAB_00135838;
      }
      break;
    case 4:
switchD_00135426_caseD_10:
      snprintf(buf,buflen,"X509 - Allocation of memory failed");
      if (sVar4 == 0x2980) goto switchD_00135426_caseD_12;
      if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
      break;
    case 5:
switchD_00135426_caseD_11:
      snprintf(buf,buflen,"X509 - Read/write of file failed");
      if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
      break;
    case 6:
switchD_00135426_caseD_12:
      pcVar3 = "X509 - Destination buffer is too small";
      goto LAB_00135838;
    }
    goto switchD_00135426_default;
  case 0x37:
    goto switchD_00131ddf_caseD_1;
  case 0x38:
switchD_00131ddf_caseD_2:
    snprintf(buf,buflen,"PK - Elliptic curve is unsupported (only NIST curves are supported)");
switchD_00131d67_default:
    switch(uVar5 - 0x3900 >> 7) {
    case 0:
      goto switchD_00131ddf_caseD_0;
    case 1:
      goto switchD_00131ddf_caseD_1;
    case 0xf:
      goto switchD_00132acf_caseD_0;
    case 0x10:
      goto switchD_00132acf_caseD_1;
    case 0x11:
      goto switchD_00132acf_caseD_2;
    case 0x12:
      goto switchD_00132acf_caseD_3;
    case 0x13:
      goto switchD_00132acf_caseD_4;
    case 0x14:
      goto switchD_00132acf_caseD_5;
    case 0x15:
      goto switchD_00132acf_caseD_6;
    case 0x16:
      goto switchD_00132acf_caseD_7;
    case 0x17:
      goto switchD_00132acf_caseD_8;
    }
    goto switchD_00132649_caseD_2;
  case 0x39:
switchD_00131ddf_caseD_3:
    __format = "PK - The algorithm tag or value is invalid";
LAB_001325da:
    snprintf(buf,buflen,__format);
    switch(uVar5 - 0x3900 >> 7) {
    case 0:
      goto switchD_00131ddf_caseD_0;
    case 1:
      goto switchD_00131ddf_caseD_1;
    case 2:
      goto switchD_00131ddf_caseD_2;
    case 0xf:
      goto switchD_00132acf_caseD_0;
    case 0x10:
      goto switchD_00132acf_caseD_1;
    case 0x11:
      goto switchD_00132acf_caseD_2;
    case 0x12:
      goto switchD_00132acf_caseD_3;
    case 0x13:
      goto switchD_00132acf_caseD_4;
    case 0x14:
      goto switchD_00132acf_caseD_5;
    case 0x15:
      goto switchD_00132acf_caseD_6;
    case 0x16:
      goto switchD_00132acf_caseD_7;
    case 0x17:
      goto switchD_00132acf_caseD_8;
    }
    goto switchD_0013260d_caseD_3;
  case 0x3a:
switchD_00131ddf_caseD_4:
    __format_00 = "PK - The pubkey tag or value is invalid (only RSA and EC are supported)";
LAB_0013259b:
    snprintf(buf,buflen,__format_00);
    switch(uVar5 - 0x3900 >> 7) {
    case 0:
      goto switchD_00131ddf_caseD_0;
    case 1:
      goto switchD_00131ddf_caseD_1;
    case 2:
      goto switchD_00131ddf_caseD_2;
    case 3:
      goto switchD_00131ddf_caseD_3;
    case 0xf:
      goto switchD_00132acf_caseD_0;
    case 0x10:
      goto switchD_00132acf_caseD_1;
    case 0x11:
      goto switchD_00132acf_caseD_2;
    case 0x12:
      goto switchD_00132acf_caseD_3;
    case 0x13:
      goto switchD_00132acf_caseD_4;
    case 0x14:
      goto switchD_00132acf_caseD_5;
    case 0x15:
      goto switchD_00132acf_caseD_6;
    case 0x16:
      goto switchD_00132acf_caseD_7;
    case 0x17:
      goto switchD_00132acf_caseD_8;
    }
    goto switchD_001325d1_caseD_4;
  case 0x3b:
switchD_00131ddf_caseD_5:
    pcVar3 = "PK - Given private key password does not allow for correct decryption";
    break;
  case 0x3c:
switchD_00131ddf_caseD_6:
    pcVar3 = "PK - Private key password can\'t be empty";
    break;
  case 0x3d:
switchD_00131ddf_caseD_7:
    pcVar3 = "PK - Key algorithm is unsupported (only RSA and EC are supported)";
    goto LAB_0013265e;
  case 0x3e:
switchD_00131ddf_caseD_8:
    snprintf(buf,buflen,"PK - Invalid key tag or value");
    switch(uVar5 - 0x3980 >> 7) {
    case 0:
      goto switchD_00131ddf_caseD_1;
    case 1:
      goto switchD_00131ddf_caseD_2;
    case 2:
      goto switchD_00131ddf_caseD_3;
    case 3:
      goto switchD_00131ddf_caseD_4;
    case 4:
      local_40 = "PK - Given private key password does not allow for correct decryption";
      break;
    case 5:
      local_40 = "PK - Private key password can\'t be empty";
      break;
    case 6:
      goto switchD_00131ddf_caseD_7;
    default:
      goto switchD_00132592_default;
    }
    goto LAB_00133a1e;
  case 0x3f:
switchD_00131ddf_caseD_9:
    pcVar3 = "PK - Unsupported key version";
LAB_001323ec:
    snprintf(buf,buflen,pcVar3);
    if (sVar4 == 0x1e00) goto switchD_001323d7_caseD_0;
    pcVar3 = "PKCS12 - PBE ASN.1 data not as expected";
    if (uVar5 == 0x1e80) goto LAB_00135777;
    if (uVar5 == 0x1f00) goto switchD_001323d7_caseD_2;
    if (uVar5 == 0x1f80) goto switchD_001323d7_caseD_3;
    if (uVar5 == 0x2e00) goto switchD_001323d7_caseD_20;
    if (uVar5 == 0x2e80) goto switchD_001323d7_caseD_21;
    if (uVar5 == 0x2f00) goto switchD_001323d7_caseD_22;
    if (uVar5 == 0x2f80) goto switchD_001323d7_caseD_23;
    if (uVar5 == 0x3900) goto switchD_00131ddf_caseD_0;
    if (uVar5 == 0x3980) goto switchD_00131ddf_caseD_1;
    if (uVar5 == 0x3a00) goto switchD_00131ddf_caseD_2;
    if (uVar5 == 0x3a80) goto switchD_00131ddf_caseD_3;
    if (uVar5 == 0x3b00) goto switchD_00131ddf_caseD_4;
    if (uVar5 == 0x3b80) goto switchD_00131ddf_caseD_5;
    if (uVar5 == 0x3c00) goto switchD_00131ddf_caseD_6;
    if (uVar5 == 0x3c80) goto switchD_00131ddf_caseD_7;
    if (uVar5 == 0x4480) goto switchD_00132acf_caseD_8;
    if (uVar5 == 0x4080) goto switchD_00132acf_caseD_0;
    if (uVar5 == 0x4100) goto switchD_00132acf_caseD_1;
    if (uVar5 == 0x4180) goto switchD_00132acf_caseD_2;
    if (uVar5 == 0x4200) goto switchD_00132acf_caseD_3;
    if (uVar5 == 0x4280) goto switchD_00132acf_caseD_4;
    if (uVar5 == 0x4300) goto switchD_00132acf_caseD_5;
    if (uVar5 == 0x4380) goto switchD_00132acf_caseD_6;
    if (uVar5 == 0x4400) goto switchD_00132acf_caseD_7;
    if (uVar5 == 0x3d00) goto switchD_00131ddf_caseD_8;
    goto LAB_00132ba9;
  case 0x45:
    goto switchD_00132acf_caseD_0;
  case 0x46:
    goto switchD_00132acf_caseD_1;
  case 0x47:
switchD_00132acf_caseD_2:
    snprintf(buf,buflen,"RSA - Something failed during generation of a key");
    uVar1 = uVar5 - 0x4200 >> 7;
    if (uVar1 < 5) {
      (*(code *)(&DAT_00155a74 + *(int *)(&DAT_00155a74 + (ulong)uVar1 * 4)))();
      return;
    }
    goto switchD_00131da3_caseD_e;
  case 0x48:
switchD_00132acf_caseD_3:
    snprintf(buf,buflen,"RSA - Key failed to pass the library\'s validity check");
LAB_00132747:
    if (sVar4 == 0x4280) goto switchD_00132acf_caseD_4;
    if (uVar5 == 0x4300) goto switchD_00132acf_caseD_5;
    if (uVar5 == 0x4380) goto switchD_00132acf_caseD_6;
    if (uVar5 == 0x7f80) {
      pcVar3 = "SSL - Hardware acceleration function returned with error";
      goto LAB_001356c3;
    }
    if (uVar5 == 0x4480) goto switchD_00132acf_caseD_8;
    if (uVar5 == 0x6d00) goto switchD_00132b8f_caseD_a;
    if (uVar5 == 0x6d80) goto switchD_00132b8f_caseD_b;
    if (uVar5 == 0x6e00) goto switchD_00132b8f_caseD_c;
    if (uVar5 == 0x6e80) goto switchD_00132b8f_caseD_d;
    if (uVar5 != 0x6f00) {
      if (uVar5 == 0x6f80) goto switchD_00132b8f_caseD_f;
      if (uVar5 == 0x7080) {
        pcVar3 = "SSL - The requested feature is not available";
        goto LAB_001329d0;
      }
      if (uVar5 == 0x7100) goto switchD_00132a03_caseD_e;
      if (uVar5 == 0x7180) goto switchD_00132a03_caseD_f;
      if (uVar5 == 0x7200) goto switchD_00132b17_caseD_0;
      if (uVar5 == 0x7280) goto switchD_00132b53_caseD_14;
      if (uVar5 == 0x7300) goto switchD_00132b8f_caseD_16;
      if (uVar5 == 0x7380) goto switchD_00132b8f_caseD_17;
      if (uVar5 == 0x7400) goto switchD_00132b8f_caseD_18;
      if (uVar5 == 0x7480) goto switchD_00132b8f_caseD_19;
      if (uVar5 == 0x7500) goto switchD_00132b8f_caseD_1a;
      if (uVar5 == 0x7580) goto switchD_00132b8f_caseD_1b;
      if (uVar5 == 0x7600) goto switchD_00132b8f_caseD_1c;
      if (uVar5 == 0x7680) goto switchD_00132b8f_caseD_1d;
      if (uVar5 == 0x7700) goto switchD_00132b8f_caseD_1e;
      if (uVar5 == 0x7780) goto switchD_00132b8f_caseD_1f;
      if (uVar5 == 0x7800) goto switchD_00132b8f_caseD_20;
      if (uVar5 == 0x7880) goto switchD_00132b8f_caseD_21;
      if (uVar5 == 0x7900) goto switchD_00132b8f_caseD_22;
      if (uVar5 == 0x7980) goto switchD_00132b8f_caseD_23;
      if (uVar5 == 0x7a00) goto switchD_00132b8f_caseD_24;
      if (uVar5 == 0x7a80) goto switchD_00132b8f_caseD_25;
      if (uVar5 == 0x7b00) goto switchD_00132b8f_caseD_26;
      if (uVar5 == 0x7b80) goto switchD_00132b8f_caseD_27;
      if (uVar5 == 0x7c00) goto switchD_00132b8f_caseD_28;
      if (uVar5 == 0x7c80) goto switchD_00132b8f_caseD_29;
      if (uVar5 == 32000) goto switchD_00132b8f_caseD_2a;
      if (uVar5 == 0x7d80) goto switchD_00132b8f_caseD_2b;
      if (uVar5 == 0x7e00) goto switchD_00132b8f_caseD_2c;
      if (uVar5 == 0x7e80) {
        pcVar3 = "SSL - Processing of the Finished handshake message failed";
        break;
      }
      if (uVar5 == 0x7f00) {
        pcVar3 = "SSL - Memory allocation failed";
        goto LAB_00135777;
      }
      if (uVar5 == 0x4400) goto switchD_00132acf_caseD_7;
      goto LAB_00134567;
    }
    goto LAB_0013591d;
  case 0x49:
switchD_00132acf_caseD_4:
    pcVar3 = "RSA - The public key operation failed";
    goto LAB_0013439a;
  case 0x4a:
switchD_00132acf_caseD_5:
    pcVar3 = "RSA - The private key operation failed";
    break;
  case 0x4b:
switchD_00132acf_caseD_6:
    pcVar3 = "RSA - The PKCS#1 verification failed";
    goto LAB_00132ae4;
  case 0x4c:
switchD_00132acf_caseD_7:
    snprintf(buf,buflen,"RSA - The output buffer for decryption is not large enough");
switchD_00131da3_caseD_e:
    if (uVar5 != 0x4480) goto LAB_001356d4;
switchD_00132acf_caseD_8:
    snprintf(buf,buflen,"RSA - The random generator failed to generate non-zeros");
    uVar1 = uVar5 - 0x7080 >> 7;
    if (uVar1 < 5) {
      (*(code *)(&DAT_00155a88 + *(int *)(&DAT_00155a88 + (ulong)uVar1 * 4)))();
      return;
    }
LAB_00132b6d:
    switch(uVar5 - 0x6800 >> 7) {
    case 0:
      goto switchD_00132b8f_caseD_0;
    case 1:
      goto switchD_00132b8f_caseD_1;
    case 2:
      goto switchD_00132b8f_caseD_2;
    case 3:
      goto switchD_00132b8f_caseD_3;
    case 4:
      goto switchD_00132b8f_caseD_4;
    case 5:
      goto switchD_00132b8f_caseD_5;
    case 6:
      goto switchD_00132b8f_caseD_6;
    case 7:
      goto switchD_00132b8f_caseD_7;
    case 8:
      goto switchD_00132b8f_caseD_8;
    case 9:
      goto switchD_00132b8f_caseD_9;
    case 10:
      goto switchD_00132b8f_caseD_a;
    case 0xb:
      goto switchD_00132b8f_caseD_b;
    case 0xc:
      goto switchD_00132b8f_caseD_c;
    case 0xd:
      goto switchD_00132b8f_caseD_d;
    case 0xe:
      goto switchD_00132b8f_caseD_e;
    case 0xf:
      goto switchD_00132b8f_caseD_f;
    default:
      goto switchD_00132b8f_caseD_10;
    case 0x16:
switchD_00132b8f_caseD_16:
      pcVar3 = "SSL - An unknown cipher was received";
LAB_00132b98:
      snprintf(buf,buflen,pcVar3);
LAB_00132ba9:
      switch(uVar5 - 0x6780 >> 7) {
      case 0:
        goto switchD_00134b09_caseD_0;
      case 1:
        goto switchD_00132b8f_caseD_0;
      case 2:
        goto switchD_00132b8f_caseD_1;
      case 3:
        goto switchD_00132b8f_caseD_2;
      case 4:
        goto switchD_00132b8f_caseD_3;
      case 5:
        goto switchD_00132b8f_caseD_4;
      case 6:
        goto switchD_00132b8f_caseD_5;
      case 7:
        goto switchD_00132b8f_caseD_6;
      case 8:
        goto switchD_00132b8f_caseD_7;
      case 9:
        goto switchD_00132b8f_caseD_8;
      case 10:
        goto switchD_00132b8f_caseD_9;
      case 0xb:
        goto switchD_00132b8f_caseD_a;
      case 0xc:
        goto switchD_00132b8f_caseD_b;
      case 0xd:
        goto switchD_00132b8f_caseD_c;
      case 0xe:
        goto switchD_00132b8f_caseD_d;
      case 0xf:
        goto switchD_00132b8f_caseD_e;
      case 0x10:
        goto switchD_00132b8f_caseD_f;
      case 0x18:
        goto switchD_00132b8f_caseD_17;
      case 0x19:
        goto switchD_00132b8f_caseD_18;
      case 0x1a:
        goto switchD_00132b8f_caseD_19;
      case 0x1b:
        goto switchD_00132b8f_caseD_1a;
      case 0x1c:
        goto switchD_00132b8f_caseD_1b;
      case 0x1d:
        goto switchD_00132b8f_caseD_1c;
      case 0x1e:
        goto switchD_00132b8f_caseD_1d;
      case 0x1f:
        goto switchD_00132b8f_caseD_1e;
      case 0x20:
        goto switchD_00132b8f_caseD_1f;
      case 0x21:
        goto switchD_00132b8f_caseD_20;
      case 0x22:
        goto switchD_00132b8f_caseD_21;
      case 0x23:
        goto switchD_00132b8f_caseD_22;
      case 0x24:
        goto switchD_00132b8f_caseD_23;
      case 0x25:
        goto switchD_00132b8f_caseD_24;
      case 0x26:
        goto switchD_00132b8f_caseD_25;
      case 0x27:
        goto switchD_00132b8f_caseD_26;
      case 0x28:
        goto switchD_00132b8f_caseD_27;
      case 0x29:
        goto switchD_00132b8f_caseD_28;
      case 0x2a:
        goto switchD_00132b8f_caseD_29;
      case 0x2b:
        goto switchD_00132b8f_caseD_2a;
      case 0x2c:
        goto switchD_00132b8f_caseD_2b;
      case 0x2d:
        goto switchD_00132b8f_caseD_2c;
      case 0x2e:
        goto switchD_00132b8f_caseD_2d;
      case 0x2f:
        goto switchD_00132b8f_caseD_2e;
      case 0x30:
        goto switchD_00132b8f_caseD_2f;
      }
      goto switchD_00134b09_default;
    case 0x17:
switchD_00132b8f_caseD_17:
      snprintf(buf,buflen,"SSL - The server has no ciphersuites in common with the client");
LAB_00132be5:
      switch(uVar5 - 0x6700 >> 7) {
      case 0:
        goto switchD_00132c5b_caseD_2;
      case 1:
        goto switchD_00134b09_caseD_0;
      case 2:
        goto switchD_00132b8f_caseD_0;
      case 3:
        goto switchD_00132b8f_caseD_1;
      case 4:
        goto switchD_00132b8f_caseD_2;
      case 5:
        goto switchD_00132b8f_caseD_3;
      case 6:
        goto switchD_00132b8f_caseD_4;
      case 7:
        goto switchD_00132b8f_caseD_5;
      case 8:
        goto switchD_00132b8f_caseD_6;
      case 9:
        goto switchD_00132b8f_caseD_7;
      case 10:
        goto switchD_00132b8f_caseD_8;
      case 0xb:
        goto switchD_00132b8f_caseD_9;
      case 0xc:
        goto switchD_00132b8f_caseD_a;
      case 0xd:
        goto switchD_00132b8f_caseD_b;
      case 0xe:
        goto switchD_00132b8f_caseD_c;
      case 0xf:
        goto switchD_00132b8f_caseD_d;
      case 0x10:
        goto switchD_00132b8f_caseD_e;
      case 0x11:
        goto switchD_00132b8f_caseD_f;
      case 0x1a:
        goto switchD_00132b8f_caseD_18;
      case 0x1b:
        goto switchD_00132b8f_caseD_19;
      case 0x1c:
        goto switchD_00132b8f_caseD_1a;
      case 0x1d:
        goto switchD_00132b8f_caseD_1b;
      case 0x1e:
        goto switchD_00132b8f_caseD_1c;
      case 0x1f:
        goto switchD_00132b8f_caseD_1d;
      case 0x20:
        goto switchD_00132b8f_caseD_1e;
      case 0x21:
        goto switchD_00132b8f_caseD_1f;
      case 0x22:
        goto switchD_00132b8f_caseD_20;
      case 0x23:
        goto switchD_00132b8f_caseD_21;
      case 0x24:
        goto switchD_00132b8f_caseD_22;
      case 0x25:
        goto switchD_00132b8f_caseD_23;
      case 0x26:
        goto switchD_00132b8f_caseD_24;
      case 0x27:
        goto switchD_00132b8f_caseD_25;
      case 0x28:
        goto switchD_00132b8f_caseD_26;
      case 0x29:
        goto switchD_00132b8f_caseD_27;
      case 0x2a:
        goto switchD_00132b8f_caseD_28;
      case 0x2b:
        goto switchD_00132b8f_caseD_29;
      case 0x2c:
        goto switchD_00132b8f_caseD_2a;
      case 0x2d:
        goto switchD_00132b8f_caseD_2b;
      case 0x2e:
        goto switchD_00132b8f_caseD_2c;
      case 0x2f:
        goto switchD_00132b8f_caseD_2d;
      case 0x30:
        goto switchD_00132b8f_caseD_2e;
      case 0x31:
        goto switchD_00132b8f_caseD_2f;
      }
      goto switchD_00132c07_caseD_12;
    case 0x18:
switchD_00132b8f_caseD_18:
      pcVar3 = "SSL - No RNG was provided to the SSL module";
LAB_0013265e:
      snprintf(buf,buflen,pcVar3);
switchD_0013207b_default:
      switch(uVar5 - 0x6680 >> 7) {
      case 0:
        goto switchD_00132c5b_caseD_1;
      case 1:
        goto switchD_00132c5b_caseD_2;
      case 2:
        goto switchD_00134b09_caseD_0;
      case 3:
        goto switchD_00132b8f_caseD_0;
      case 4:
        goto switchD_00132b8f_caseD_1;
      case 5:
        goto switchD_00132b8f_caseD_2;
      case 6:
        goto switchD_00132b8f_caseD_3;
      case 7:
        goto switchD_00132b8f_caseD_4;
      case 8:
        goto switchD_00132b8f_caseD_5;
      case 9:
        goto switchD_00132b8f_caseD_6;
      case 10:
        goto switchD_00132b8f_caseD_7;
      case 0xb:
        goto switchD_00132b8f_caseD_8;
      case 0xc:
        goto switchD_00132b8f_caseD_9;
      case 0xd:
        goto switchD_00132b8f_caseD_a;
      case 0xe:
        goto switchD_00132b8f_caseD_b;
      case 0xf:
        goto switchD_00132b8f_caseD_c;
      case 0x10:
        goto switchD_00132b8f_caseD_d;
      case 0x11:
        goto switchD_00132b8f_caseD_e;
      case 0x12:
        goto switchD_00132b8f_caseD_f;
      case 0x1c:
        goto switchD_00132b8f_caseD_19;
      case 0x1d:
        goto switchD_00132b8f_caseD_1a;
      case 0x1e:
        goto switchD_00132b8f_caseD_1b;
      case 0x1f:
        goto switchD_00132b8f_caseD_1c;
      case 0x20:
        goto switchD_00132b8f_caseD_1d;
      case 0x21:
        goto switchD_00132b8f_caseD_1e;
      case 0x22:
        goto switchD_00132b8f_caseD_1f;
      case 0x23:
        goto switchD_00132b8f_caseD_20;
      case 0x24:
        goto switchD_00132b8f_caseD_21;
      case 0x25:
        goto switchD_00132b8f_caseD_22;
      case 0x26:
        goto switchD_00132b8f_caseD_23;
      case 0x27:
        goto switchD_00132b8f_caseD_24;
      case 0x28:
        goto switchD_00132b8f_caseD_25;
      case 0x29:
        goto switchD_00132b8f_caseD_26;
      case 0x2a:
        goto switchD_00132b8f_caseD_27;
      case 0x2b:
        goto switchD_00132b8f_caseD_28;
      case 0x2c:
        goto switchD_00132b8f_caseD_29;
      case 0x2d:
        goto switchD_00132b8f_caseD_2a;
      case 0x2e:
        goto switchD_00132b8f_caseD_2b;
      case 0x2f:
        goto switchD_00132b8f_caseD_2c;
      case 0x30:
        goto switchD_00132b8f_caseD_2d;
      case 0x31:
        goto switchD_00132b8f_caseD_2e;
      case 0x32:
        goto switchD_00132b8f_caseD_2f;
      }
      goto switchD_00132691_caseD_13;
    case 0x19:
switchD_00132b8f_caseD_19:
      pcVar3 = 
      "SSL - No client certification received from the client, but required by the authentication mode"
      ;
LAB_00132c28:
      snprintf(buf,buflen,pcVar3);
      switch(uVar5 - 0x6600 >> 7) {
      case 0:
        goto switchD_00132c5b_caseD_0;
      case 1:
        goto switchD_00132c5b_caseD_1;
      case 2:
        goto switchD_00132c5b_caseD_2;
      case 3:
        goto switchD_00134b09_caseD_0;
      case 4:
        goto switchD_00132b8f_caseD_0;
      case 5:
        goto switchD_00132b8f_caseD_1;
      case 6:
        goto switchD_00132b8f_caseD_2;
      case 7:
        goto switchD_00132b8f_caseD_3;
      case 8:
        goto switchD_00132b8f_caseD_4;
      case 9:
        goto switchD_00132b8f_caseD_5;
      case 10:
        goto switchD_00132b8f_caseD_6;
      case 0xb:
        goto switchD_00132b8f_caseD_7;
      case 0xc:
        goto switchD_00132b8f_caseD_8;
      case 0xd:
        goto switchD_00132b8f_caseD_9;
      case 0xe:
        goto switchD_00132b8f_caseD_a;
      case 0xf:
        goto switchD_00132b8f_caseD_b;
      case 0x10:
        goto switchD_00132b8f_caseD_c;
      case 0x11:
        goto switchD_00132b8f_caseD_d;
      case 0x12:
        goto switchD_00132b8f_caseD_e;
      case 0x13:
        goto switchD_00132b8f_caseD_f;
      case 0x1e:
        goto switchD_00132b8f_caseD_1a;
      case 0x1f:
        goto switchD_00132b8f_caseD_1b;
      case 0x20:
        goto switchD_00132b8f_caseD_1c;
      case 0x21:
        goto switchD_00132b8f_caseD_1d;
      case 0x22:
        goto switchD_00132b8f_caseD_1e;
      case 0x23:
switchD_00132b8f_caseD_1f:
        snprintf(buf,buflen,"SSL - A fatal alert message was received from our peer");
        return;
      case 0x24:
        goto switchD_00132b8f_caseD_20;
      case 0x25:
        goto switchD_00132b8f_caseD_21;
      case 0x26:
        goto switchD_00132b8f_caseD_22;
      case 0x27:
        goto switchD_00132b8f_caseD_23;
      case 0x28:
        goto switchD_00132b8f_caseD_24;
      case 0x29:
        goto switchD_00132b8f_caseD_25;
      case 0x2a:
        goto switchD_00132b8f_caseD_26;
      case 0x2b:
        goto switchD_00132b8f_caseD_27;
      case 0x2c:
        goto switchD_00132b8f_caseD_28;
      case 0x2d:
        goto switchD_00132b8f_caseD_29;
      case 0x2e:
        goto switchD_00132b8f_caseD_2a;
      case 0x2f:
        goto switchD_00132b8f_caseD_2b;
      case 0x30:
        goto switchD_00132b8f_caseD_2c;
      case 0x31:
        goto switchD_00132b8f_caseD_2d;
      case 0x32:
        goto switchD_00132b8f_caseD_2e;
      case 0x33:
        goto switchD_00132b8f_caseD_2f;
      }
      goto switchD_00132c5b_caseD_14;
    case 0x1a:
switchD_00132b8f_caseD_1a:
      snprintf(buf,buflen,"SSL - Our own certificate(s) is/are too large to send in an SSL message")
      ;
      uVar1 = uVar5 - 0x7580 >> 7;
      if (uVar1 < 5) {
        (*(code *)(&DAT_00156068 + *(int *)(&DAT_00156068 + (ulong)uVar1 * 4)))();
        return;
      }
      if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
      if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
      if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
      if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
      if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
      if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
      if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
      if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
      if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
      if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
      if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
      if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
      if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
      if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
      if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
      if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
      if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
      if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
      if (uVar5 == 0x6c00) goto switchD_00132b8f_caseD_8;
      if (uVar5 == 0x6c80) goto switchD_00132b8f_caseD_9;
      if (uVar5 == 0x6d00) goto switchD_00132b8f_caseD_a;
      if (uVar5 == 0x6d80) goto switchD_00132b8f_caseD_b;
      if (uVar5 == 0x6e00) goto switchD_00132b8f_caseD_c;
      if (uVar5 == 0x6e80) goto switchD_00132b8f_caseD_d;
      if (uVar5 == 0x6f00) goto LAB_0013591d;
      if (uVar5 == 0x6f80) goto switchD_00132b8f_caseD_f;
      goto switchD_0013549e_default;
    case 0x1b:
switchD_00132b8f_caseD_1b:
      snprintf(buf,buflen,"SSL - The own certificate is not set, but needed by the server");
      uVar1 = uVar5 - 0x7600 >> 7;
      if (uVar1 < 5) {
        (*(code *)(&DAT_0015607c + *(int *)(&DAT_0015607c + (ulong)uVar1 * 4)))();
        return;
      }
      break;
    case 0x1c:
switchD_00132b8f_caseD_1c:
      snprintf(buf,buflen,"SSL - The own private key or pre-shared key is not set, but needed");
      uVar1 = uVar5 - 0x7680 >> 7;
      if (uVar1 < 4) {
        (*(code *)(&DAT_00156090 + *(int *)(&DAT_00156090 + (ulong)uVar1 * 4)))();
        return;
      }
      break;
    case 0x1d:
switchD_00132b8f_caseD_1d:
      snprintf(buf,buflen,"SSL - No CA Chain is set, but required to operate");
      uVar1 = uVar5 - 0x7700 >> 7;
      if (uVar1 < 4) {
        (*(code *)(&DAT_001560a0 + *(int *)(&DAT_001560a0 + (ulong)uVar1 * 4)))();
        return;
      }
      goto LAB_00133000;
    case 0x1e:
switchD_00132b8f_caseD_1e:
      snprintf(buf,buflen,"SSL - An unexpected message was received from our peer");
      uVar1 = uVar5 - 0x7780 >> 7;
      if (uVar1 < 4) {
        (*(code *)(&DAT_001560b0 + *(int *)(&DAT_001560b0 + (ulong)uVar1 * 4)))();
        return;
      }
      goto LAB_00133188;
    case 0x1f:
      goto switchD_00132b8f_caseD_1f;
    case 0x20:
switchD_00132b8f_caseD_20:
      snprintf(buf,buflen,"SSL - Verification of our peer failed");
      break;
    case 0x21:
      goto switchD_00132b8f_caseD_21;
    case 0x22:
      goto switchD_00132b8f_caseD_22;
    case 0x23:
      goto switchD_00132b8f_caseD_23;
    case 0x24:
      goto switchD_00132b8f_caseD_24;
    case 0x25:
      goto switchD_00132b8f_caseD_25;
    case 0x26:
      goto switchD_00132b8f_caseD_26;
    case 0x27:
      goto switchD_00132b8f_caseD_27;
    case 0x28:
      goto switchD_00132b8f_caseD_28;
    case 0x29:
      goto switchD_00132b8f_caseD_29;
    case 0x2a:
      goto switchD_00132b8f_caseD_2a;
    case 0x2b:
      goto switchD_00132b8f_caseD_2b;
    case 0x2c:
      goto switchD_00132b8f_caseD_2c;
    case 0x2d:
      goto switchD_00132b8f_caseD_2d;
    case 0x2e:
      goto switchD_00132b8f_caseD_2e;
    case 0x2f:
      goto switchD_00132b8f_caseD_2f;
    }
    switch(uVar5 - 0x6780 >> 7) {
    case 0:
      goto switchD_00134b09_caseD_0;
    case 1:
      goto switchD_00132b8f_caseD_0;
    case 2:
      goto switchD_00132b8f_caseD_1;
    case 3:
      goto switchD_00132b8f_caseD_2;
    case 4:
      goto switchD_00132b8f_caseD_3;
    case 5:
      goto switchD_00132b8f_caseD_4;
    case 6:
      goto switchD_00132b8f_caseD_5;
    case 7:
      goto switchD_00132b8f_caseD_6;
    case 8:
      goto switchD_00132b8f_caseD_7;
    case 9:
      goto switchD_00132b8f_caseD_8;
    case 10:
      goto switchD_00132b8f_caseD_9;
    case 0xb:
      goto switchD_00132b8f_caseD_a;
    case 0xc:
      goto switchD_00132b8f_caseD_b;
    case 0xd:
      goto switchD_00132b8f_caseD_c;
    case 0xe:
      goto switchD_00132b8f_caseD_d;
    case 0xf:
switchD_00132b8f_caseD_e:
      snprintf(buf,buflen,"SSL - Processing of the compression / decompression failed");
      if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
      if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
      if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
      if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
      if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
      if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
      if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
      if (uVar5 == 0x2400) goto switchD_00135426_caseD_7;
      if (uVar5 == 0x2480) goto switchD_00135426_caseD_8;
      if (uVar5 == 0x2500) goto switchD_00135426_caseD_9;
      if (uVar5 == 0x2580) goto switchD_00135426_caseD_a;
      if (uVar5 == 0x2600) goto switchD_00135426_caseD_b;
      if (uVar5 == 0x2680) goto switchD_00135426_caseD_c;
      if (uVar5 == 0x2700) goto switchD_00135426_caseD_d;
      if (uVar5 == 0x2780) goto switchD_00135426_caseD_e;
      if (uVar5 == 0x2800) goto LAB_00135911;
      if (uVar5 == 0x2880) goto LAB_001357de;
      if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
      if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
      if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
      if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
      if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
      if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
      if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
      if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
      if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
      if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
      if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
      if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
      if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
      if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
      if (uVar5 == 0x6c00) goto switchD_00132b8f_caseD_8;
      if (uVar5 == 0x6c80) goto switchD_00132b8f_caseD_9;
      if (uVar5 == 0x6d00) goto switchD_00132b8f_caseD_a;
      if (uVar5 == 0x6d80) goto switchD_00132b8f_caseD_b;
      if (uVar5 == 0x6e00) goto switchD_00132b8f_caseD_c;
      if (uVar5 == 0x6e80) goto switchD_00132b8f_caseD_d;
      goto switchD_00135426_default;
    case 0x10:
      goto switchD_00132b8f_caseD_f;
    default:
      goto switchD_00134b09_default;
    case 0x22:
switchD_00132b8f_caseD_21:
      snprintf(buf,buflen,"SSL - The peer notified us that the connection is going to be closed");
LAB_00133000:
      if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
      if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
      if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
      if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
      if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
      if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
      if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
      if (uVar5 == 0x2400) goto switchD_00135426_caseD_7;
      if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
      if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
      if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
      if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
      if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
      if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
      if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
      if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
      if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
      if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
      if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
      if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
      if (uVar5 == 0x6c00) goto switchD_00132b8f_caseD_8;
      if (uVar5 == 0x6c80) goto switchD_00132b8f_caseD_9;
      if (uVar5 == 0x6d00) goto switchD_00132b8f_caseD_a;
      if (uVar5 == 0x6d80) goto switchD_00132b8f_caseD_b;
      if (uVar5 == 0x6e00) goto switchD_00132b8f_caseD_c;
      if (uVar5 == 0x6e80) goto switchD_00132b8f_caseD_d;
      if (uVar5 == 0x6f00) goto LAB_0013591d;
      if (uVar5 == 0x6f80) goto switchD_00132b8f_caseD_f;
      goto LAB_001355e4;
    case 0x23:
switchD_00132b8f_caseD_22:
      snprintf(buf,buflen,"SSL - Processing of the ClientHello handshake message failed");
LAB_00133188:
      if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
      if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
      if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
      if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
      if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
      if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
      if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
      if (uVar5 == 0x2400) goto switchD_00135426_caseD_7;
      if (uVar5 == 0x2480) goto switchD_00135426_caseD_8;
      if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
      if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
      if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
      if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
      if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
      if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
      if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
      if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
      if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
      if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
      if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
      if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
      if (uVar5 == 0x6c00) goto switchD_00132b8f_caseD_8;
      if (uVar5 == 0x6c80) goto switchD_00132b8f_caseD_9;
      if (uVar5 == 0x6d00) goto switchD_00132b8f_caseD_a;
      if (uVar5 == 0x6d80) goto switchD_00132b8f_caseD_b;
      if (uVar5 == 0x6e00) goto switchD_00132b8f_caseD_c;
      if (uVar5 == 0x6e80) goto switchD_00132b8f_caseD_d;
      if (uVar5 == 0x6f00) goto LAB_0013591d;
      if (uVar5 == 0x6f80) goto switchD_00132b8f_caseD_f;
      goto LAB_00135620;
    case 0x24:
switchD_00132b8f_caseD_23:
      snprintf(buf,buflen,"SSL - Processing of the ServerHello handshake message failed");
      uVar1 = uVar5 - 0x7a00 >> 7;
      if (uVar1 < 4) {
        (*(code *)(&DAT_00156184 + *(int *)(&DAT_00156184 + (ulong)uVar1 * 4)))();
        return;
      }
      goto switchD_00132649_caseD_2;
    case 0x25:
switchD_00132b8f_caseD_24:
      snprintf(buf,buflen,"SSL - Processing of the Certificate handshake message failed");
      uVar1 = uVar5 - 0x7a80 >> 7;
      if (uVar1 < 4) {
        (*(code *)(&DAT_00156194 + *(int *)(&DAT_00156194 + (ulong)uVar1 * 4)))();
        return;
      }
      goto switchD_00132592_default;
    case 0x26:
switchD_00132b8f_caseD_25:
      pcVar3 = "SSL - Processing of the CertificateRequest handshake message failed";
      goto LAB_00133858;
    case 0x27:
switchD_00132b8f_caseD_26:
      snprintf(buf,buflen,"SSL - Processing of the ServerKeyExchange handshake message failed");
switchD_0013260d_caseD_3:
      if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
      if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
      if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
      if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
      if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
      if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
      if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
      if (uVar5 == 0x2400) goto switchD_00135426_caseD_7;
      if (uVar5 == 0x2480) goto switchD_00135426_caseD_8;
      if (uVar5 == 0x2500) goto switchD_00135426_caseD_9;
      if (uVar5 == 0x2580) goto switchD_00135426_caseD_a;
      if (uVar5 == 0x2600) goto switchD_00135426_caseD_b;
      if (uVar5 == 0x2680) goto switchD_00135426_caseD_c;
      if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
      if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
      if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
      if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
      if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
      if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
      if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
      if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
      if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
      if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
      if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
      if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
      if (uVar5 == 0x6c00) goto switchD_00132b8f_caseD_8;
      if (uVar5 == 0x6c80) goto switchD_00132b8f_caseD_9;
      if (uVar5 == 0x6d00) goto switchD_00132b8f_caseD_a;
      if (uVar5 == 0x6d80) goto switchD_00132b8f_caseD_b;
      if (uVar5 == 0x6e00) goto switchD_00132b8f_caseD_c;
      if (uVar5 == 0x6e80) goto switchD_00132b8f_caseD_d;
      if (uVar5 == 0x6f00) goto LAB_0013591d;
      if (uVar5 == 0x6f80) goto switchD_00132b8f_caseD_f;
      goto LAB_00135710;
    case 0x28:
switchD_00132b8f_caseD_27:
      snprintf(buf,buflen,"SSL - Processing of the ServerHelloDone handshake message failed");
switchD_00132649_caseD_2:
      if (sVar4 != 0x2080) {
        if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
        if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
        if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
        if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
        if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
        if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
        if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
        if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
        if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
        if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
        if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
        if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
        if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
        if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
        if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
        if (uVar5 == 0x6c00) goto switchD_00132b8f_caseD_8;
        if (uVar5 == 0x6c80) goto switchD_00132b8f_caseD_9;
        if (uVar5 == 0x6d00) goto switchD_00132b8f_caseD_a;
        if (uVar5 == 0x6d80) goto switchD_00132b8f_caseD_b;
        if (uVar5 == 0x6e00) goto switchD_00132b8f_caseD_c;
        if (uVar5 == 0x6e80) goto switchD_00132b8f_caseD_d;
        if (uVar5 == 0x6f00) goto LAB_0013591d;
        if (uVar5 == 0x6f80) goto switchD_00132b8f_caseD_f;
        goto LAB_001354f4;
      }
      goto switchD_00135426_caseD_0;
    case 0x29:
switchD_00132b8f_caseD_28:
      local_48 = "SSL - Processing of the ClientKeyExchange handshake message failed";
switchD_00131ddf_caseD_1:
      snprintf(buf,buflen,local_48);
switchD_00132592_default:
      if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
      if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
      if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
      if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
      if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
      if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
      if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
      if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
      if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
      if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
      if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
      if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
      if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
      if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
      if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
      if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
      if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
      if (uVar5 == 0x6c00) goto switchD_00132b8f_caseD_8;
      if (uVar5 == 0x6c80) goto switchD_00132b8f_caseD_9;
      if (uVar5 == 0x6d00) goto switchD_00132b8f_caseD_a;
      if (uVar5 == 0x6d80) goto switchD_00132b8f_caseD_b;
      if (uVar5 == 0x6e00) goto switchD_00132b8f_caseD_c;
      if (uVar5 == 0x6e80) goto switchD_00132b8f_caseD_d;
      if (uVar5 == 0x6f00) goto LAB_0013591d;
      if (uVar5 == 0x6f80) goto switchD_00132b8f_caseD_f;
      goto LAB_00135530;
    case 0x2a:
switchD_00132b8f_caseD_29:
      local_40 = 
      "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Read Public"
      ;
switchD_00132acf_caseD_1:
      break;
    case 0x2b:
switchD_00132b8f_caseD_2a:
      local_40 = 
      "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Calculate Secret"
      ;
      break;
    case 0x2c:
switchD_00132b8f_caseD_2b:
      local_40 = "SSL - Processing of the CertificateVerify handshake message failed";
      break;
    case 0x2d:
switchD_00132b8f_caseD_2c:
      local_40 = "SSL - Processing of the ChangeCipherSpec handshake message failed";
      break;
    case 0x2e:
switchD_00132b8f_caseD_2d:
      local_40 = "SSL - Processing of the Finished handshake message failed";
      break;
    case 0x2f:
switchD_00132b8f_caseD_2e:
      snprintf(buf,buflen,"SSL - Memory allocation failed");
      if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
      if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
      if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
      if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
      if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
      if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
      if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
      if (uVar5 == 0x2400) goto switchD_00135426_caseD_7;
      if (uVar5 == 0x2480) goto switchD_00135426_caseD_8;
      if (uVar5 == 0x2500) goto switchD_00135426_caseD_9;
      if (uVar5 == 0x2580) goto switchD_00135426_caseD_a;
      if (uVar5 == 0x2600) goto switchD_00135426_caseD_b;
      if (uVar5 == 0x2680) goto switchD_00135426_caseD_c;
      if (uVar5 == 0x2700) goto switchD_00135426_caseD_d;
      if (uVar5 == 0x2780) goto switchD_00135426_caseD_e;
      if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
      if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
      if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
      if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
      if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
      if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
      if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
      if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
      if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
      if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
      if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
      if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
      if (uVar5 == 0x6c00) goto switchD_00132b8f_caseD_8;
      if (uVar5 == 0x6c80) goto switchD_00132b8f_caseD_9;
      if (uVar5 == 0x6d00) goto switchD_00132b8f_caseD_a;
      if (uVar5 == 0x6d80) goto switchD_00132b8f_caseD_b;
      if (uVar5 == 0x6e00) goto switchD_00132b8f_caseD_c;
      if (uVar5 == 0x6e80) goto switchD_00132b8f_caseD_d;
      if (uVar5 == 0x6f00) goto LAB_0013591d;
      if (uVar5 == 0x6f80) goto switchD_00132b8f_caseD_f;
      goto LAB_00135788;
    case 0x30:
switchD_00132b8f_caseD_2f:
      pcVar3 = "SSL - Hardware acceleration function returned with error";
LAB_00133858:
      snprintf(buf,buflen,pcVar3);
switchD_001325d1_caseD_4:
      if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
      if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
      if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
      if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
      if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
      if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
      if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
      if (uVar5 == 0x2400) goto switchD_00135426_caseD_7;
      if (uVar5 == 0x2480) goto switchD_00135426_caseD_8;
      if (uVar5 != 0x2500) {
        if (uVar5 != 0x2580) {
          if (uVar5 == 0x2600) goto switchD_00135426_caseD_b;
          if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
          if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
          if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
          if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
          if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
          if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
          if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
          if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
          if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
          if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
          if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
          if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
          if (uVar5 == 0x6c00) goto switchD_00132b8f_caseD_8;
          if (uVar5 == 0x6c80) goto switchD_00132b8f_caseD_9;
          if (uVar5 == 0x6d00) goto switchD_00132b8f_caseD_a;
          if (uVar5 == 0x6d80) goto switchD_00132b8f_caseD_b;
          if (uVar5 == 0x6e00) goto switchD_00132b8f_caseD_c;
          if (uVar5 == 0x6e80) goto switchD_00132b8f_caseD_d;
          if (uVar5 == 0x6f00) goto LAB_0013591d;
          if (uVar5 == 0x6f80) goto switchD_00132b8f_caseD_f;
          goto LAB_001356d4;
        }
        goto switchD_00135426_caseD_a;
      }
      goto switchD_00135426_caseD_9;
    }
LAB_00133a1e:
    snprintf(buf,buflen,local_40);
switchD_00132b17_default:
    if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
    if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
    if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
    if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
    if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
    if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
    if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
    if (uVar5 == 0x2400) goto switchD_00135426_caseD_7;
    if (uVar5 == 0x2480) goto switchD_00135426_caseD_8;
    if (uVar5 == 0x2500) goto switchD_00135426_caseD_9;
    if (uVar5 == 0x2580) goto switchD_00135426_caseD_a;
    if (uVar5 == 0x2600) goto switchD_00135426_caseD_b;
    if (uVar5 == 0x2680) goto switchD_00135426_caseD_c;
    if (uVar5 == 0x2700) goto switchD_00135426_caseD_d;
    if (uVar5 == 0x2780) goto switchD_00135426_caseD_e;
    if (uVar5 == 0x2800) {
LAB_00135911:
      pcVar3 = "X509 - Input invalid";
      break;
    }
    if (uVar5 == 0x2880) goto LAB_001357de;
    if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
    if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
    if (uVar5 != 0x6600) {
      if (uVar5 == 0x6680) {
switchD_00132c5b_caseD_1:
        snprintf(buf,buflen,"SSL - The alert message received indicates a non-fatal error");
switchD_00132691_caseD_13:
        if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
        if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
        if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
        if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
        if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
        if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
        if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
        if (uVar5 == 0x2400) goto switchD_00135426_caseD_7;
        if (uVar5 == 0x2480) goto switchD_00135426_caseD_8;
        if (uVar5 == 0x2500) goto switchD_00135426_caseD_9;
        if (uVar5 == 0x2580) goto switchD_00135426_caseD_a;
        if (uVar5 == 0x2600) goto switchD_00135426_caseD_b;
        if (uVar5 == 0x2680) goto switchD_00135426_caseD_c;
        if (uVar5 == 0x2700) goto switchD_00135426_caseD_d;
        if (uVar5 != 0x2780) {
          if (uVar5 == 0x2800) goto LAB_00135911;
          if (uVar5 == 0x2880) goto LAB_001357de;
          if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
          if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
          if (uVar5 != 0x6600) goto switchD_00135426_default;
          goto switchD_00132c5b_caseD_0;
        }
        goto switchD_00135426_caseD_e;
      }
      if (uVar5 == 0x6700) {
switchD_00132c5b_caseD_2:
        snprintf(buf,buflen,"SSL - Record header looks valid but is not expected");
switchD_00132c07_caseD_12:
        if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
        if (uVar5 != 0x2100) {
          if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
          if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
          if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
          if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
          if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
          if (uVar5 == 0x2400) goto switchD_00135426_caseD_7;
          if (uVar5 == 0x2480) goto switchD_00135426_caseD_8;
          if (uVar5 == 0x2500) goto switchD_00135426_caseD_9;
          if (uVar5 != 0x2580) {
            if (uVar5 != 0x2600) {
              if (uVar5 != 0x2680) {
                if (uVar5 != 0x2700) {
                  if (uVar5 != 0x2780) {
                    if (uVar5 == 0x2800) goto LAB_00135911;
                    if (uVar5 == 0x2880) goto LAB_001357de;
                    if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
                    if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
                    if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
                    if (uVar5 != 0x6680) goto switchD_00135426_default;
                    goto switchD_00132c5b_caseD_1;
                  }
                  goto switchD_00135426_caseD_e;
                }
                goto switchD_00135426_caseD_d;
              }
              goto switchD_00135426_caseD_c;
            }
            goto switchD_00135426_caseD_b;
          }
          goto switchD_00135426_caseD_a;
        }
switchD_00135426_caseD_1:
        snprintf(buf,buflen,"X509 - Requested OID is unknown");
        switch(uVar5 - 0x2180 >> 7) {
        case 0:
          goto switchD_00135426_caseD_2;
        case 1:
          goto switchD_00135426_caseD_3;
        case 2:
          goto switchD_00135426_caseD_4;
        case 3:
          goto switchD_00135426_caseD_5;
        }
        goto switchD_0013549e_default;
      }
      if (uVar5 == 0x6780) {
switchD_00134b09_caseD_0:
        snprintf(buf,buflen,"SSL - The client initiated a reconnect from the same port");
switchD_00134b09_default:
        if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
        if (uVar5 != 0x2100) {
          if (uVar5 != 0x2180) {
            if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
            if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
            if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
            if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
            if (uVar5 != 0x2400) {
              if (uVar5 == 0x2480) goto switchD_00135426_caseD_8;
              if (uVar5 != 0x2500) {
                if (uVar5 != 0x2580) {
                  if (uVar5 != 0x2600) {
                    if (uVar5 != 0x2680) {
                      if (uVar5 != 0x2700) {
                        if (uVar5 != 0x2780) {
                          if (uVar5 == 0x2800) goto LAB_00135911;
                          if (uVar5 == 0x2880) goto LAB_001357de;
                          if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
                          if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
                          if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
                          if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
                          if (uVar5 != 0x6700) goto switchD_00135426_default;
                          goto switchD_00132c5b_caseD_2;
                        }
                        goto switchD_00135426_caseD_e;
                      }
                      goto switchD_00135426_caseD_d;
                    }
                    goto switchD_00135426_caseD_c;
                  }
                  goto switchD_00135426_caseD_b;
                }
                goto switchD_00135426_caseD_a;
              }
              goto switchD_00135426_caseD_9;
            }
            goto switchD_00135426_caseD_7;
          }
          goto switchD_00135426_caseD_2;
        }
        goto switchD_00135426_caseD_1;
      }
      if (uVar5 == 0x6800) {
switchD_00132b8f_caseD_0:
        snprintf(buf,buflen,"SSL - The operation timed out");
switchD_00132b8f_caseD_10:
        if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
        if (uVar5 != 0x2100) {
          if (uVar5 != 0x2180) {
            if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
            if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
            if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
            if (uVar5 != 0x2380) {
              if (uVar5 == 0x2400) goto switchD_00135426_caseD_7;
              if (uVar5 != 0x2480) {
                if (uVar5 != 0x2500) {
                  if (uVar5 != 0x2580) {
                    if (uVar5 != 0x2600) {
                      if (uVar5 != 0x2680) {
                        if (uVar5 != 0x2700) {
                          if (uVar5 != 0x2780) {
                            if (uVar5 == 0x2800) goto LAB_00135911;
                            if (uVar5 == 0x2880) goto LAB_001357de;
                            if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
                            if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
                            if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
                            if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
                            if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
                            if (uVar5 != 0x6780) goto switchD_00135426_default;
                            goto switchD_00134b09_caseD_0;
                          }
                          goto switchD_00135426_caseD_e;
                        }
                        goto switchD_00135426_caseD_d;
                      }
                      goto switchD_00135426_caseD_c;
                    }
                    goto switchD_00135426_caseD_b;
                  }
                  goto switchD_00135426_caseD_a;
                }
                goto switchD_00135426_caseD_9;
              }
              goto switchD_00135426_caseD_8;
            }
            goto switchD_00135426_caseD_6;
          }
          goto switchD_00135426_caseD_2;
        }
        goto switchD_00135426_caseD_1;
      }
      if (uVar5 == 0x6880) {
switchD_00132b8f_caseD_1:
        snprintf(buf,buflen,"SSL - Connection requires a write call");
switchD_00134acd_default:
        if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
        if (uVar5 != 0x2100) {
          if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
          if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
          if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
          if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
          if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
          if (uVar5 != 0x2400) {
            if (uVar5 != 0x2480) {
              if (uVar5 != 0x2500) {
                if (uVar5 != 0x2580) {
                  if (uVar5 != 0x2600) {
                    if (uVar5 != 0x2680) {
                      if (uVar5 != 0x2700) {
                        if (uVar5 != 0x2780) {
                          if (uVar5 == 0x2800) goto LAB_00135911;
                          if (uVar5 == 0x2880) goto LAB_001357de;
                          if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
                          if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
                          if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
                          if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
                          if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
                          if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
                          if (uVar5 != 0x6800) goto switchD_00135426_default;
                          goto switchD_00132b8f_caseD_0;
                        }
                        goto switchD_00135426_caseD_e;
                      }
                      goto switchD_00135426_caseD_d;
                    }
                    goto switchD_00135426_caseD_c;
                  }
                  goto switchD_00135426_caseD_b;
                }
                goto switchD_00135426_caseD_a;
              }
              goto switchD_00135426_caseD_9;
            }
            goto switchD_00135426_caseD_8;
          }
          goto switchD_00135426_caseD_7;
        }
        goto switchD_00135426_caseD_1;
      }
      if (uVar5 == 0x6900) {
switchD_00132b8f_caseD_2:
        snprintf(buf,buflen,"SSL - Connection requires a read call");
switchD_00134a91_default:
        if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
        if (uVar5 != 0x2100) {
          if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
          if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
          if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
          if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
          if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
          if (uVar5 != 0x2400) {
            if (uVar5 != 0x2480) {
              if (uVar5 != 0x2500) {
                if (uVar5 != 0x2580) {
                  if (uVar5 != 0x2600) {
                    if (uVar5 != 0x2680) {
                      if (uVar5 != 0x2700) {
                        if (uVar5 != 0x2780) {
                          if (uVar5 == 0x2800) goto LAB_00135911;
                          if (uVar5 == 0x2880) goto LAB_001357de;
                          if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
                          if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
                          if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
                          if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
                          if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
                          if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
                          if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
                          if (uVar5 != 0x6880) goto switchD_00135426_default;
                          goto switchD_00132b8f_caseD_1;
                        }
                        goto switchD_00135426_caseD_e;
                      }
                      goto switchD_00135426_caseD_d;
                    }
                    goto switchD_00135426_caseD_c;
                  }
                  goto switchD_00135426_caseD_b;
                }
                goto switchD_00135426_caseD_a;
              }
              goto switchD_00135426_caseD_9;
            }
            goto switchD_00135426_caseD_8;
          }
          goto switchD_00135426_caseD_7;
        }
        goto switchD_00135426_caseD_1;
      }
      if (uVar5 == 0x6980) {
switchD_00132b8f_caseD_3:
        snprintf(buf,buflen,
                 "SSL - None of the common ciphersuites is usable (eg, no suitable certificate, see debug messages)"
                );
        switch(uVar5 - 0x6780 >> 7) {
        case 0:
          goto switchD_00134b09_caseD_0;
        case 1:
          goto switchD_00132b8f_caseD_0;
        case 2:
          goto switchD_00132b8f_caseD_1;
        case 3:
          goto switchD_00132b8f_caseD_2;
        }
        goto switchD_00134b09_default;
      }
      if (uVar5 == 0x6a00) {
switchD_00132b8f_caseD_4:
        snprintf(buf,buflen,"SSL - A buffer is too small to receive or write a message");
switchD_00132a03_caseD_c:
        if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
        if (uVar5 != 0x2100) {
          if (uVar5 != 0x2180) {
            if (uVar5 != 0x2200) {
              if (uVar5 != 0x2280) {
                if (uVar5 != 0x2300) {
                  if (uVar5 != 0x2380) {
                    if (uVar5 != 0x2400) {
                      if (uVar5 != 0x2480) {
                        if (uVar5 != 0x2500) {
                          if (uVar5 != 0x2580) {
                            if (uVar5 != 0x2600) {
                              if (uVar5 != 0x2680) {
                                if (uVar5 != 0x2700) {
                                  if (uVar5 != 0x2780) {
                                    if (uVar5 == 0x2800) goto LAB_00135911;
                                    if (uVar5 == 0x2880) goto LAB_001357de;
                                    if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
                                    if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
                                    if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
                                    if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
                                    if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
                                    if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
                                    if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
                                    if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
                                    if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
                                    if (uVar5 != 0x6980) goto switchD_00135426_default;
                                    goto switchD_00132b8f_caseD_3;
                                  }
                                  goto switchD_00135426_caseD_e;
                                }
                                goto switchD_00135426_caseD_d;
                              }
                              goto switchD_00135426_caseD_c;
                            }
                            goto switchD_00135426_caseD_b;
                          }
                          goto switchD_00135426_caseD_a;
                        }
                        goto switchD_00135426_caseD_9;
                      }
                      goto switchD_00135426_caseD_8;
                    }
                    goto switchD_00135426_caseD_7;
                  }
                  goto switchD_00135426_caseD_6;
                }
                goto switchD_00135426_caseD_5;
              }
              goto switchD_00135426_caseD_4;
            }
            goto switchD_00135426_caseD_3;
          }
          goto switchD_00135426_caseD_2;
        }
        goto switchD_00135426_caseD_1;
      }
      if (uVar5 == 0x6a80) {
switchD_00132b8f_caseD_5:
        snprintf(buf,buflen,"SSL - DTLS client must retry for hello verification");
        switch(uVar5 - 0x6880 >> 7) {
        case 0:
          goto switchD_00132b8f_caseD_1;
        case 1:
          goto switchD_00132b8f_caseD_2;
        case 2:
          goto switchD_00132b8f_caseD_3;
        case 3:
          goto switchD_00132b8f_caseD_4;
        }
        goto switchD_00134acd_default;
      }
      if (uVar5 == 0x6b00) {
switchD_00132b8f_caseD_6:
        snprintf(buf,buflen,"SSL - Unexpected message at ServerHello in renegotiation");
        switch(uVar5 - 0x6900 >> 7) {
        case 0:
          goto switchD_00132b8f_caseD_2;
        case 1:
          goto switchD_00132b8f_caseD_3;
        case 2:
          goto switchD_00132b8f_caseD_4;
        case 3:
          goto switchD_00132b8f_caseD_5;
        }
        goto switchD_00134a91_default;
      }
      if (uVar5 == 0x6b80) {
switchD_00132b8f_caseD_7:
        snprintf(buf,buflen,"SSL - A counter would wrap (eg, too many messages exchanged)");
switchD_00134391_default:
        if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
        if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
        if (uVar5 != 0x2180) {
          if (uVar5 != 0x2200) {
            if (uVar5 != 0x2280) {
              if (uVar5 != 0x2300) {
                if (uVar5 != 0x2380) {
                  if (uVar5 != 0x2400) {
                    if (uVar5 != 0x2480) {
                      if (uVar5 != 0x2500) {
                        if (uVar5 != 0x2580) {
                          if (uVar5 != 0x2600) {
                            if (uVar5 != 0x2680) {
                              if (uVar5 != 0x2700) {
                                if (uVar5 != 0x2780) {
                                  if (uVar5 == 0x2800) goto LAB_00135911;
                                  if (uVar5 == 0x2880) goto LAB_001357de;
                                  if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
                                  if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
                                  if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
                                  if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
                                  if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
                                  if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
                                  if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
                                  if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
                                  if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
                                  if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
                                  if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
                                  if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
                                  if (uVar5 != 0x6b00) goto switchD_00135426_default;
                                  goto switchD_00132b8f_caseD_6;
                                }
                                goto switchD_00135426_caseD_e;
                              }
                              goto switchD_00135426_caseD_d;
                            }
                            goto switchD_00135426_caseD_c;
                          }
                          goto switchD_00135426_caseD_b;
                        }
                        goto switchD_00135426_caseD_a;
                      }
                      goto switchD_00135426_caseD_9;
                    }
                    goto switchD_00135426_caseD_8;
                  }
                  goto switchD_00135426_caseD_7;
                }
                goto switchD_00135426_caseD_6;
              }
              goto switchD_00135426_caseD_5;
            }
            goto switchD_00135426_caseD_4;
          }
          goto switchD_00135426_caseD_3;
        }
        goto switchD_00135426_caseD_2;
      }
      if (uVar5 == 0x6c00) {
switchD_00132b8f_caseD_8:
        snprintf(buf,buflen,"SSL - Internal error (eg, unexpected failure in lower-level module)");
switchD_00134355_default:
        if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
        if (uVar5 != 0x2100) {
          if (uVar5 != 0x2180) {
            if (uVar5 != 0x2200) {
              if (uVar5 != 0x2280) {
                if (uVar5 != 0x2300) {
                  if (uVar5 != 0x2380) {
                    if (uVar5 != 0x2400) {
                      if (uVar5 != 0x2480) {
                        if (uVar5 != 0x2500) {
                          if (uVar5 != 0x2580) {
                            if (uVar5 != 0x2600) {
                              if (uVar5 != 0x2680) {
                                if (uVar5 != 0x2700) {
                                  if (uVar5 != 0x2780) {
                                    if (uVar5 == 0x2800) goto LAB_00135911;
                                    if (uVar5 == 0x2880) goto LAB_001357de;
                                    if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
                                    if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
                                    if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
                                    if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
                                    if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
                                    if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
                                    if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
                                    if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
                                    if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
                                    if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
                                    if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
                                    if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
                                    if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
                                    if (uVar5 != 0x6b80) goto switchD_00135426_default;
                                    goto switchD_00132b8f_caseD_7;
                                  }
                                  goto switchD_00135426_caseD_e;
                                }
                                goto switchD_00135426_caseD_d;
                              }
                              goto switchD_00135426_caseD_c;
                            }
                            goto switchD_00135426_caseD_b;
                          }
                          goto switchD_00135426_caseD_a;
                        }
                        goto switchD_00135426_caseD_9;
                      }
                      goto switchD_00135426_caseD_8;
                    }
                    goto switchD_00135426_caseD_7;
                  }
                  goto switchD_00135426_caseD_6;
                }
                goto switchD_00135426_caseD_5;
              }
              goto switchD_00135426_caseD_4;
            }
            goto switchD_00135426_caseD_3;
          }
          goto switchD_00135426_caseD_2;
        }
        goto switchD_00135426_caseD_1;
      }
      if (uVar5 == 0x6c80) {
switchD_00132b8f_caseD_9:
        pcVar3 = "SSL - Unknown identity received (eg, PSK identity)";
LAB_0013439a:
        snprintf(buf,buflen,pcVar3);
        if (sVar4 != 0x2080) {
          if (uVar5 != 0x2100) {
            if (uVar5 != 0x2180) {
              if (uVar5 != 0x2200) {
                if (uVar5 != 0x2280) {
                  if (uVar5 != 0x2300) {
                    if (uVar5 != 0x2380) {
                      if (uVar5 != 0x2400) {
                        if (uVar5 != 0x2480) {
                          if (uVar5 != 0x2500) {
                            if (uVar5 != 0x2580) {
                              if (uVar5 != 0x2600) {
                                if (uVar5 != 0x2680) {
                                  if (uVar5 != 0x2700) {
                                    if (uVar5 != 0x2780) {
                                      if (uVar5 == 0x2800) goto LAB_00135911;
                                      if (uVar5 == 0x2880) goto LAB_001357de;
                                      if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
                                      if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
                                      if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
                                      if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
                                      if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
                                      if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
                                      if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
                                      if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
                                      if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
                                      if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
                                      if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
                                      if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
                                      if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
                                      if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
                                      if (uVar5 != 0x6c00) goto switchD_00135426_default;
                                      goto switchD_00132b8f_caseD_8;
                                    }
                                    goto switchD_00135426_caseD_e;
                                  }
                                  goto switchD_00135426_caseD_d;
                                }
                                goto switchD_00135426_caseD_c;
                              }
                              goto switchD_00135426_caseD_b;
                            }
                            goto switchD_00135426_caseD_a;
                          }
                          goto switchD_00135426_caseD_9;
                        }
                        goto switchD_00135426_caseD_8;
                      }
                      goto switchD_00135426_caseD_7;
                    }
                    goto switchD_00135426_caseD_6;
                  }
                  goto switchD_00135426_caseD_5;
                }
                goto switchD_00135426_caseD_4;
              }
              goto switchD_00135426_caseD_3;
            }
            goto switchD_00135426_caseD_2;
          }
          goto switchD_00135426_caseD_1;
        }
switchD_00135426_caseD_0:
        snprintf(buf,buflen,"X509 - Unavailable feature, e.g. RSA hashing/encryption combination");
        uVar1 = uVar5 - 0x2100 >> 7;
        if (uVar1 < 4) {
          (*(code *)(&DAT_00156240 + *(int *)(&DAT_00156240 + (ulong)uVar1 * 4)))();
          return;
        }
        goto LAB_00135530;
      }
      if (uVar5 == 0x6d00) {
switchD_00132b8f_caseD_a:
        snprintf(buf,buflen,
                 "SSL - Public key type mismatch (eg, asked for RSA key exchange and presented EC key)"
                );
LAB_00134567:
        if (sVar4 != 0x2080) {
          if (uVar5 != 0x2100) {
            if (uVar5 != 0x2180) {
              if (uVar5 != 0x2200) {
                if (uVar5 != 0x2280) {
                  if (uVar5 != 0x2300) {
                    if (uVar5 != 0x2380) {
                      if (uVar5 != 0x2400) {
                        if (uVar5 != 0x2480) {
                          if (uVar5 != 0x2500) {
                            if (uVar5 != 0x2580) {
                              if (uVar5 != 0x2600) {
                                if (uVar5 != 0x2680) {
                                  if (uVar5 != 0x2700) {
                                    if (uVar5 != 0x2780) {
                                      if (uVar5 == 0x2800) goto LAB_00135911;
                                      if (uVar5 == 0x2880) goto LAB_001357de;
                                      if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
                                      if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
                                      if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
                                      if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
                                      if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
                                      if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
                                      if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
                                      if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
                                      if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
                                      if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
                                      if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
                                      if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
                                      if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
                                      if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
                                      if (uVar5 == 0x6c00) goto switchD_00132b8f_caseD_8;
                                      if (uVar5 != 0x6c80) goto switchD_00135426_default;
                                      goto switchD_00132b8f_caseD_9;
                                    }
                                    goto switchD_00135426_caseD_e;
                                  }
                                  goto switchD_00135426_caseD_d;
                                }
                                goto switchD_00135426_caseD_c;
                              }
                              goto switchD_00135426_caseD_b;
                            }
                            goto switchD_00135426_caseD_a;
                          }
                          goto switchD_00135426_caseD_9;
                        }
                        goto switchD_00135426_caseD_8;
                      }
                      goto switchD_00135426_caseD_7;
                    }
                    goto switchD_00135426_caseD_6;
                  }
                  goto switchD_00135426_caseD_5;
                }
                goto switchD_00135426_caseD_4;
              }
              goto switchD_00135426_caseD_3;
            }
            goto switchD_00135426_caseD_2;
          }
          goto switchD_00135426_caseD_1;
        }
        goto switchD_00135426_caseD_0;
      }
      if (uVar5 == 0x6d80) {
switchD_00132b8f_caseD_b:
        snprintf(buf,buflen,"SSL - Session ticket has expired");
        switch(uVar5 - 0x6b80 >> 7) {
        case 0:
          goto switchD_00132b8f_caseD_7;
        case 1:
          goto switchD_00132b8f_caseD_8;
        case 2:
          goto switchD_00132b8f_caseD_9;
        case 3:
          goto switchD_00132b8f_caseD_a;
        }
        goto switchD_00134391_default;
      }
      if (uVar5 == 0x6e00) {
switchD_00132b8f_caseD_c:
        snprintf(buf,buflen,"SSL - Processing of the NewSessionTicket handshake message failed");
        switch(uVar5 - 0x6c00 >> 7) {
        case 0:
          goto switchD_00132b8f_caseD_8;
        case 1:
          goto switchD_00132b8f_caseD_9;
        case 2:
          goto switchD_00132b8f_caseD_a;
        case 3:
          goto switchD_00132b8f_caseD_b;
        }
        goto switchD_00134355_default;
      }
      if (uVar5 != 0x6e80) {
        if (uVar5 == 0x6f00) {
LAB_0013591d:
          pcVar3 = "SSL - Processing of the compression / decompression failed";
          break;
        }
        if (uVar5 == 0x6f80) {
switchD_00132b8f_caseD_f:
          snprintf(buf,buflen,"SSL - Hardware acceleration function skipped / left alone data");
switchD_00132acf_default:
          if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
          if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
          if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
          if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
          if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
          if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
          if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
          if (uVar5 == 0x2400) goto switchD_00135426_caseD_7;
          if (uVar5 == 0x2480) goto switchD_00135426_caseD_8;
          if (uVar5 == 0x2500) goto switchD_00135426_caseD_9;
          if (uVar5 == 0x2580) goto switchD_00135426_caseD_a;
          if (uVar5 == 0x2600) goto switchD_00135426_caseD_b;
          if (uVar5 == 0x2680) goto switchD_00135426_caseD_c;
          if (uVar5 == 0x2700) goto switchD_00135426_caseD_d;
          if (uVar5 == 0x2780) goto switchD_00135426_caseD_e;
          if (uVar5 == 0x2800) goto LAB_00135911;
          if (uVar5 == 0x2880) goto LAB_001357de;
          if (uVar5 == 0x2900) goto switchD_00135426_caseD_11;
          if (uVar5 == 0x2980) goto switchD_00135426_caseD_12;
          if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
          if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
          if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
          if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
          if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
          if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
          if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
          if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
          if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
          if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
          if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
          if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
          if (uVar5 == 0x6c00) goto switchD_00132b8f_caseD_8;
          if (uVar5 == 0x6c80) goto switchD_00132b8f_caseD_9;
          if (uVar5 == 0x6d00) goto switchD_00132b8f_caseD_a;
          if (uVar5 == 0x6d80) goto switchD_00132b8f_caseD_b;
          if (uVar5 == 0x6e00) goto switchD_00132b8f_caseD_c;
          if (uVar5 == 0x6e80) goto switchD_00132b8f_caseD_d;
          if (uVar5 == 0x6f00) goto LAB_0013591d;
        }
        goto switchD_00135426_default;
      }
switchD_00132b8f_caseD_d:
      local_50 = "SSL - Handshake protocol not within min/max boundaries";
switchD_00132acf_caseD_0:
      snprintf(buf,buflen,local_50);
      if (sVar4 == 0x2080) goto switchD_00135426_caseD_0;
      if (uVar5 == 0x2100) goto switchD_00135426_caseD_1;
      if (uVar5 == 0x2180) goto switchD_00135426_caseD_2;
      if (uVar5 == 0x2200) goto switchD_00135426_caseD_3;
      if (uVar5 == 0x2280) goto switchD_00135426_caseD_4;
      if (uVar5 == 0x2300) goto switchD_00135426_caseD_5;
      if (uVar5 == 0x2380) goto switchD_00135426_caseD_6;
      if (uVar5 == 0x2400) goto switchD_00135426_caseD_7;
      if (uVar5 == 0x2480) goto switchD_00135426_caseD_8;
      if (uVar5 == 0x2500) goto switchD_00135426_caseD_9;
      if (uVar5 == 0x2580) goto switchD_00135426_caseD_a;
      if (uVar5 == 0x2600) goto switchD_00135426_caseD_b;
      if (uVar5 == 0x2680) goto switchD_00135426_caseD_c;
      if (uVar5 == 0x2700) goto switchD_00135426_caseD_d;
      if (uVar5 == 0x2780) goto switchD_00135426_caseD_e;
      if (uVar5 == 0x6600) goto switchD_00132c5b_caseD_0;
      if (uVar5 == 0x6680) goto switchD_00132c5b_caseD_1;
      if (uVar5 == 0x6700) goto switchD_00132c5b_caseD_2;
      if (uVar5 == 0x6780) goto switchD_00134b09_caseD_0;
      if (uVar5 == 0x6800) goto switchD_00132b8f_caseD_0;
      if (uVar5 == 0x6880) goto switchD_00132b8f_caseD_1;
      if (uVar5 == 0x6900) goto switchD_00132b8f_caseD_2;
      if (uVar5 == 0x6980) goto switchD_00132b8f_caseD_3;
      if (uVar5 == 0x6a00) goto switchD_00132b8f_caseD_4;
      if (uVar5 == 0x6a80) goto switchD_00132b8f_caseD_5;
      if (uVar5 == 0x6b00) goto switchD_00132b8f_caseD_6;
      if (uVar5 == 0x6b80) goto switchD_00132b8f_caseD_7;
      if (uVar5 == 0x6c00) goto switchD_00132b8f_caseD_8;
      if (uVar5 == 0x6c80) goto switchD_00132b8f_caseD_9;
      if (uVar5 == 0x6d00) goto switchD_00132b8f_caseD_a;
      if (uVar5 == 0x6d80) goto switchD_00132b8f_caseD_b;
      if (uVar5 == 0x6e00) goto switchD_00132b8f_caseD_c;
      goto LAB_00135788;
    }
switchD_00132c5b_caseD_0:
    snprintf(buf,buflen,"SSL - Couldn\'t set the hash for verifying CertificateVerify");
switchD_00132c5b_caseD_14:
    switch(uVar5 - 0x2080 >> 7) {
    case 0:
      goto switchD_00135426_caseD_0;
    case 1:
      goto switchD_00135426_caseD_1;
    case 2:
switchD_00135426_caseD_2:
      snprintf(buf,buflen,"X509 - The CRT/CRL/CSR format is invalid, e.g. different type expected");
      switch(uVar5 - 0x2200 >> 7) {
      case 0:
        goto switchD_00135426_caseD_3;
      case 1:
        goto switchD_00135426_caseD_4;
      case 2:
        goto switchD_00135426_caseD_5;
      case 3:
        goto switchD_00135426_caseD_6;
      }
      goto switchD_001354da_default;
    case 3:
switchD_00135426_caseD_3:
      pcVar3 = "X509 - The CRT/CRL/CSR version element is invalid";
LAB_001354e3:
      snprintf(buf,buflen,pcVar3);
LAB_001354f4:
      switch(uVar5 - 0x2280 >> 7) {
      case 0:
        goto switchD_00135426_caseD_4;
      case 1:
        goto switchD_00135426_caseD_5;
      case 2:
        goto switchD_00135426_caseD_6;
      case 3:
        goto switchD_00135426_caseD_7;
      case 4:
        goto switchD_00135426_caseD_8;
      case 5:
        goto switchD_00135426_caseD_9;
      case 6:
        goto switchD_00135426_caseD_a;
      case 7:
        goto switchD_00135426_caseD_b;
      case 8:
        goto switchD_00135426_caseD_c;
      case 9:
        goto switchD_00135426_caseD_d;
      case 10:
        goto switchD_00135426_caseD_e;
      case 0xb:
        goto switchD_00135426_caseD_f;
      case 0xc:
        goto switchD_00135426_caseD_10;
      case 0xd:
        goto switchD_00135426_caseD_11;
      case 0xe:
        goto switchD_00135426_caseD_12;
      }
      break;
    case 4:
switchD_00135426_caseD_4:
      snprintf(buf,buflen,"X509 - The serial tag or value is invalid");
LAB_00135530:
      switch(uVar5 - 0x2300 >> 7) {
      case 0:
        goto switchD_00135426_caseD_5;
      case 1:
        goto switchD_00135426_caseD_6;
      case 2:
        goto switchD_00135426_caseD_7;
      case 3:
        goto switchD_00135426_caseD_8;
      case 4:
        goto switchD_00135426_caseD_9;
      case 5:
        goto switchD_00135426_caseD_a;
      case 6:
        goto switchD_00135426_caseD_b;
      case 7:
        goto switchD_00135426_caseD_c;
      case 8:
        goto switchD_00135426_caseD_d;
      case 9:
        goto switchD_00135426_caseD_e;
      case 10:
        goto switchD_00135426_caseD_f;
      case 0xb:
        goto switchD_00135426_caseD_10;
      case 0xc:
        goto switchD_00135426_caseD_11;
      case 0xd:
        goto switchD_00135426_caseD_12;
      }
      break;
    case 5:
switchD_00135426_caseD_5:
      snprintf(buf,buflen,"X509 - The algorithm tag or value is invalid");
switchD_0013549e_default:
      switch(uVar5 - 0x2380 >> 7) {
      case 0:
        goto switchD_00135426_caseD_6;
      case 1:
        goto switchD_00135426_caseD_7;
      case 2:
        goto switchD_00135426_caseD_8;
      case 3:
        goto switchD_00135426_caseD_9;
      case 4:
        goto switchD_00135426_caseD_a;
      case 5:
        goto switchD_00135426_caseD_b;
      case 6:
        goto switchD_00135426_caseD_c;
      case 7:
        goto switchD_00135426_caseD_d;
      case 8:
        goto switchD_00135426_caseD_e;
      case 9:
        goto switchD_00135426_caseD_f;
      case 10:
        goto switchD_00135426_caseD_10;
      case 0xb:
        goto switchD_00135426_caseD_11;
      case 0xc:
        goto switchD_00135426_caseD_12;
      }
      break;
    case 6:
switchD_00135426_caseD_6:
      snprintf(buf,buflen,"X509 - The name tag or value is invalid");
switchD_001354da_default:
      switch(uVar5 - 0x2400 >> 7) {
      case 0:
switchD_00135426_caseD_7:
        snprintf(buf,buflen,"X509 - The date tag or value is invalid");
LAB_001355e4:
        switch(uVar5 - 0x2480 >> 7) {
        case 0:
          goto switchD_00135426_caseD_8;
        case 1:
          goto switchD_00135426_caseD_9;
        case 2:
          goto switchD_00135426_caseD_a;
        case 3:
          goto switchD_00135426_caseD_b;
        case 4:
          goto switchD_00135426_caseD_c;
        case 5:
          goto switchD_00135426_caseD_d;
        case 6:
          goto switchD_00135426_caseD_e;
        case 7:
          goto switchD_00135426_caseD_f;
        case 8:
          goto switchD_00135426_caseD_10;
        case 9:
          goto switchD_00135426_caseD_11;
        case 10:
          goto switchD_00135426_caseD_12;
        }
        break;
      case 1:
switchD_00135426_caseD_8:
        snprintf(buf,buflen,"X509 - The signature tag or value invalid");
LAB_00135620:
        switch(uVar5 - 0x2500 >> 7) {
        case 0:
          goto switchD_00135426_caseD_9;
        case 1:
          goto switchD_00135426_caseD_a;
        case 2:
          goto switchD_00135426_caseD_b;
        case 3:
          goto switchD_00135426_caseD_c;
        case 4:
          goto switchD_00135426_caseD_d;
        case 5:
          goto switchD_00135426_caseD_e;
        case 6:
          goto switchD_00135426_caseD_f;
        case 7:
          goto switchD_00135426_caseD_10;
        case 8:
          goto switchD_00135426_caseD_11;
        case 9:
          goto switchD_00135426_caseD_12;
        }
        break;
      case 2:
switchD_00135426_caseD_9:
        snprintf(buf,buflen,"X509 - The extension tag or value is invalid");
        uVar1 = uVar5 - 0x2580 >> 7;
        if (uVar1 < 4) {
          (*(code *)(&DAT_0015639c + *(int *)(&DAT_0015639c + (ulong)uVar1 * 4)))();
          return;
        }
        goto LAB_0013574c;
      case 3:
switchD_00135426_caseD_a:
        snprintf(buf,buflen,"X509 - CRT/CRL/CSR has an unsupported version number");
        uVar1 = uVar5 - 0x2600 >> 7;
        if (uVar1 < 4) {
          (*(code *)(&DAT_001563ac + *(int *)(&DAT_001563ac + (ulong)uVar1 * 4)))();
          return;
        }
        goto LAB_00135788;
      case 4:
switchD_00135426_caseD_b:
        pcVar3 = "X509 - Signature algorithm (oid) is unsupported";
        goto LAB_001356c3;
      case 5:
        goto switchD_00135426_caseD_c;
      case 6:
        goto switchD_00135426_caseD_d;
      case 7:
        goto switchD_00135426_caseD_e;
      case 8:
        goto switchD_00135426_caseD_f;
      case 9:
        goto switchD_00135426_caseD_10;
      case 10:
        goto switchD_00135426_caseD_11;
      case 0xb:
        goto switchD_00135426_caseD_12;
      }
      break;
    case 7:
      goto switchD_00135426_caseD_7;
    case 8:
      goto switchD_00135426_caseD_8;
    case 9:
      goto switchD_00135426_caseD_9;
    case 10:
      goto switchD_00135426_caseD_a;
    case 0xb:
      goto switchD_00135426_caseD_b;
    case 0xc:
      goto switchD_00135426_caseD_c;
    case 0xd:
      goto switchD_00135426_caseD_d;
    case 0xe:
      goto switchD_00135426_caseD_e;
    case 0xf:
      goto switchD_00135426_caseD_f;
    case 0x10:
      goto switchD_00135426_caseD_10;
    case 0x11:
      goto switchD_00135426_caseD_11;
    case 0x12:
      goto switchD_00135426_caseD_12;
    }
    goto switchD_00135426_default;
  case 0x4d:
    goto switchD_00132acf_caseD_8;
  }
LAB_00135838:
  snprintf(buf,buflen,pcVar3);
switchD_00135426_default:
  if (*buf == '\0') {
    snprintf(buf,buflen,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar5);
  }
LAB_00135872:
  uVar5 = uVar6 & 0x7fff007f;
  if ((uVar6 & 0x7fff007f) == 0) {
    return;
  }
  sVar2 = strlen(buf);
  local_58 = buflen;
  if (sVar2 != 0) {
    if (buflen - sVar2 < 5) {
      return;
    }
    snprintf(buf + sVar2,buflen - sVar2," : ");
    buf = buf + sVar2 + 3;
    local_58 = buflen - (sVar2 + 3);
  }
  uVar6 = uVar5 - 2;
  switch(uVar6) {
  case 0:
switchD_001358da_caseD_0:
    pcVar3 = "BIGNUM - An error occurred while reading from or writing to a file";
    break;
  case 1:
    pcVar3 = "HMAC_DRBG - Too many random requested in single call";
    break;
  case 2:
switchD_001358da_caseD_2:
    snprintf(buf,local_58,"BIGNUM - Bad input parameters to function");
    switch(uVar5 - 6 >> 1 | (uint)((uVar5 - 6 & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_001358da_caseD_4;
    case 1:
      goto switchD_001358da_caseD_6;
    case 2:
      goto switchD_001358da_caseD_8;
    case 3:
      goto switchD_00135ad4_caseD_0;
    case 4:
      goto switchD_00135ad4_caseD_1;
    case 5:
      goto switchD_00135ad4_caseD_2;
    default:
      goto switchD_00135a6a_caseD_5;
    case 8:
      goto switchD_00135ad4_caseD_5;
    case 9:
      goto switchD_00135ad4_caseD_6;
    case 0xf:
      goto switchD_001358da_caseD_22;
    }
  case 3:
    goto switchD_001358da_caseD_3;
  case 4:
switchD_001358da_caseD_4:
    snprintf(buf,local_58,"BIGNUM - There is an invalid character in the digit string");
    switch(uVar5 - 8 >> 1 | (uint)((uVar5 - 8 & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_001358da_caseD_6;
    case 1:
      goto switchD_001358da_caseD_8;
    case 2:
      goto switchD_00135ad4_caseD_0;
    case 3:
      goto switchD_00135ad4_caseD_1;
    case 4:
      goto switchD_00135ad4_caseD_2;
    case 7:
      goto switchD_00135ad4_caseD_5;
    case 8:
      goto switchD_00135ad4_caseD_6;
    case 0xe:
      goto switchD_001358da_caseD_22;
    }
    goto switchD_00135a6a_caseD_5;
  case 5:
    goto switchD_001358da_caseD_5;
  case 6:
switchD_001358da_caseD_6:
    snprintf(buf,local_58,"BIGNUM - The buffer is too small to write to");
    switch(uVar5 - 10 >> 1 | (uint)((uVar5 - 10 & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_001358da_caseD_8;
    case 1:
      goto switchD_00135ad4_caseD_0;
    case 2:
      goto switchD_00135ad4_caseD_1;
    case 3:
      goto switchD_00135ad4_caseD_2;
    default:
      goto switchD_00135ad4_caseD_3;
    case 6:
      goto switchD_00135ad4_caseD_5;
    case 7:
      goto switchD_00135ad4_caseD_6;
    case 0xd:
      goto switchD_001358da_caseD_22;
    case 0xe:
      goto switchD_001358da_caseD_24;
    }
  case 7:
    goto switchD_001358da_caseD_7;
  case 8:
switchD_001358da_caseD_8:
    snprintf(buf,local_58,"BIGNUM - The input arguments are negative or result in illegal output");
    switch(uVar5 - 0xc >> 1 | (uint)((uVar5 - 0xc & 1) != 0) << 0x1f) {
    case 0:
switchD_00135ad4_caseD_0:
      snprintf(buf,local_58,"BIGNUM - The input argument for division is zero, which is not allowed"
              );
      switch(uVar5) {
      case 5:
        goto switchD_001358da_caseD_3;
      default:
        goto switchD_00135c93_caseD_47;
      case 7:
        goto switchD_001358da_caseD_5;
      case 9:
        goto switchD_001358da_caseD_7;
      case 0xb:
        goto switchD_00135e2c_caseD_b;
      case 0xd:
        goto switchD_001358da_caseD_b;
      case 0xe:
        goto switchD_001358da_caseD_c;
      case 0xf:
        goto switchD_001358da_caseD_d;
      case 0x10:
        goto switchD_001358da_caseD_e;
      case 0x12:
        goto switchD_001358da_caseD_10;
      case 0x14:
        goto switchD_001358da_caseD_12;
      case 0x16:
        goto switchD_001358da_caseD_14;
      case 0x18:
        goto switchD_001358da_caseD_16;
      case 0x24:
        goto switchD_001358da_caseD_22;
      case 0x26:
        goto switchD_001358da_caseD_24;
      case 0x28:
        goto switchD_00135b07_caseD_28;
      }
    case 1:
switchD_00135ad4_caseD_1:
      snprintf(buf,local_58,"BIGNUM - The input arguments are not acceptable");
      switch(uVar5) {
      case 5:
        goto switchD_001358da_caseD_3;
      case 6:
      case 8:
      case 10:
      case 0xc:
      case 0xe:
      case 0x11:
      case 0x13:
      case 0x15:
      case 0x17:
        goto switchD_00135c93_caseD_47;
      case 7:
        goto switchD_001358da_caseD_5;
      case 9:
        goto switchD_001358da_caseD_7;
      case 0xb:
        goto switchD_00135e2c_caseD_b;
      case 0xd:
        goto switchD_001358da_caseD_b;
      case 0xf:
        goto switchD_001358da_caseD_d;
      case 0x10:
        goto switchD_001358da_caseD_e;
      case 0x12:
        goto switchD_001358da_caseD_10;
      case 0x14:
        goto switchD_001358da_caseD_12;
      case 0x16:
        goto switchD_001358da_caseD_14;
      case 0x18:
        goto switchD_001358da_caseD_16;
      default:
switchD_00135be6_default:
        if (uVar5 == 0x24) goto switchD_001358da_caseD_22;
        if (uVar5 == 0x26) goto switchD_001358da_caseD_24;
      }
      break;
    case 2:
switchD_00135ad4_caseD_2:
      snprintf(buf,local_58,"BIGNUM - Memory allocation failed");
      switch(uVar5) {
      case 5:
        goto switchD_001358da_caseD_3;
      case 6:
      case 8:
      case 10:
      case 0xc:
      case 0xe:
      case 0x10:
      case 0x11:
      case 0x13:
      case 0x15:
      case 0x17:
        goto switchD_00135c93_caseD_47;
      case 7:
        goto switchD_001358da_caseD_5;
      case 9:
        goto switchD_001358da_caseD_7;
      case 0xb:
        goto switchD_00135e2c_caseD_b;
      case 0xd:
        goto switchD_001358da_caseD_b;
      case 0xf:
        goto switchD_001358da_caseD_d;
      case 0x12:
        goto switchD_001358da_caseD_10;
      case 0x14:
        goto switchD_001358da_caseD_12;
      case 0x16:
        goto switchD_001358da_caseD_14;
      case 0x18:
        goto switchD_001358da_caseD_16;
      default:
        goto switchD_00135be6_default;
      }
    default:
      goto switchD_00135ad4_caseD_3;
    case 5:
switchD_00135ad4_caseD_5:
      snprintf(buf,local_58,"BLOWFISH - Invalid key length");
      switch(uVar5) {
      case 5:
        goto switchD_001358da_caseD_3;
      case 6:
      case 8:
      case 10:
      case 0xc:
      case 0xe:
      case 0x10:
      case 0x11:
      case 0x13:
      case 0x15:
      case 0x16:
      case 0x17:
        goto switchD_00135c93_caseD_47;
      case 7:
        goto switchD_001358da_caseD_5;
      case 9:
        goto switchD_001358da_caseD_7;
      case 0xb:
        goto switchD_00135e2c_caseD_b;
      case 0xd:
        goto switchD_001358da_caseD_b;
      case 0xf:
        goto switchD_001358da_caseD_d;
      case 0x12:
        goto switchD_001358da_caseD_10;
      case 0x14:
        goto switchD_001358da_caseD_12;
      case 0x18:
        goto switchD_001358da_caseD_16;
      default:
        goto switchD_00135be6_default;
      }
    case 6:
switchD_00135ad4_caseD_6:
      snprintf(buf,local_58,"BLOWFISH - Invalid data input length");
      switch(uVar5) {
      case 0x43:
        goto switchD_00135c93_caseD_43;
      case 0x44:
        goto switchD_00135c93_caseD_44;
      case 0x45:
        goto switchD_00135c93_caseD_45;
      case 0x46:
        goto switchD_00135c93_caseD_46;
      case 0x47:
      case 0x49:
      case 0x4b:
      case 0x4d:
      case 0x4f:
      case 0x51:
        goto switchD_00135c93_caseD_47;
      case 0x48:
        goto switchD_00135c93_caseD_48;
      case 0x4a:
        goto switchD_00135c93_caseD_4a;
      case 0x4c:
        goto switchD_00135c93_caseD_4c;
      case 0x4e:
        goto switchD_00135c93_caseD_4e;
      case 0x50:
        goto switchD_00135c93_caseD_50;
      case 0x52:
        goto switchD_00135c93_caseD_52;
      default:
        switch(uVar5) {
        case 5:
          goto switchD_001358da_caseD_3;
        case 6:
        case 8:
        case 10:
        case 0xc:
        case 0xe:
        case 0x10:
        case 0x11:
        case 0x13:
          goto switchD_00135c93_caseD_47;
        case 7:
          goto switchD_001358da_caseD_5;
        case 9:
          goto switchD_001358da_caseD_7;
        case 0xb:
          goto switchD_00135e2c_caseD_b;
        case 0xd:
          goto switchD_001358da_caseD_b;
        case 0xf:
          goto switchD_001358da_caseD_d;
        case 0x12:
          goto switchD_001358da_caseD_10;
        case 0x14:
          goto switchD_001358da_caseD_12;
        }
        if (uVar5 != 0x30) {
          if (uVar5 == 0x26) goto switchD_001358da_caseD_24;
          if (uVar5 == 0x28) goto switchD_00135b07_caseD_28;
          if (uVar5 != 0x2e) {
            if (uVar5 != 0x24) goto switchD_00135c93_caseD_47;
            goto switchD_001358da_caseD_22;
          }
          goto LAB_00135e85;
        }
        goto LAB_00135cc9;
      }
    case 0xc:
      goto switchD_001358da_caseD_22;
    case 0xd:
      goto switchD_001358da_caseD_24;
    }
    goto switchD_00135e2c_default;
  case 9:
  case 0xf:
  case 0x11:
  case 0x13:
  case 0x15:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1f:
  case 0x21:
  case 0x23:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x31:
  case 0x33:
  case 0x35:
  case 0x37:
  case 0x39:
  case 0x3f:
    goto switchD_001358da_caseD_9;
  case 10:
switchD_001358da_caseD_a:
    pcVar3 = "BIGNUM - The input argument for division is zero, which is not allowed";
    break;
  case 0xb:
    goto switchD_001358da_caseD_b;
  case 0xc:
switchD_001358da_caseD_c:
    pcVar3 = "BIGNUM - The input arguments are not acceptable";
    break;
  case 0xd:
    goto switchD_001358da_caseD_d;
  case 0xe:
switchD_001358da_caseD_e:
    pcVar3 = "BIGNUM - Memory allocation failed";
    break;
  case 0x10:
    goto switchD_001358da_caseD_10;
  case 0x12:
    goto switchD_001358da_caseD_12;
  case 0x14:
switchD_001358da_caseD_14:
    pcVar3 = "BLOWFISH - Invalid key length";
    break;
  case 0x16:
switchD_001358da_caseD_16:
    snprintf(buf,local_58,"BLOWFISH - Invalid data input length");
switchD_001358da_caseD_9:
    switch(uVar5) {
    case 0x43:
switchD_00135c93_caseD_43:
      pcVar3 = "NET - Buffer is too small to hold the data";
      break;
    case 0x44:
switchD_00135c93_caseD_44:
      pcVar3 = "NET - The connection to the given server / port failed";
      break;
    case 0x45:
switchD_00135c93_caseD_45:
      pcVar3 = "NET - The context is invalid, eg because it was free()ed";
      break;
    case 0x46:
switchD_00135c93_caseD_46:
      pcVar3 = "NET - Binding of the socket failed";
      break;
    case 0x47:
    case 0x49:
    case 0x4b:
    case 0x4d:
    case 0x4f:
    case 0x51:
      goto switchD_00135c93_caseD_47;
    case 0x48:
switchD_00135c93_caseD_48:
      pcVar3 = "NET - Could not listen on the socket";
      break;
    case 0x4a:
switchD_00135c93_caseD_4a:
      pcVar3 = "NET - Could not accept the incoming connection";
      break;
    case 0x4c:
switchD_00135c93_caseD_4c:
      pcVar3 = "NET - Reading information from the socket failed";
      break;
    case 0x4e:
switchD_00135c93_caseD_4e:
      pcVar3 = "NET - Sending information through the socket failed";
      break;
    case 0x50:
switchD_00135c93_caseD_50:
      pcVar3 = "NET - Connection was reset by peer";
      break;
    case 0x52:
switchD_00135c93_caseD_52:
      pcVar3 = "NET - Failed to get an IP address for the given hostname";
      break;
    default:
      if (uVar5 == 0xb) {
switchD_00135e2c_caseD_b:
        pcVar3 = "OID - output buffer is too small";
      }
      else if (uVar5 == 0x28) {
switchD_00135b07_caseD_28:
        pcVar3 = "XTEA - The data input has an invalid length";
      }
      else if (uVar5 == 0x2e) {
LAB_00135e85:
        pcVar3 = "OID - OID is not found";
      }
      else {
        if (uVar5 != 0x30) goto switchD_00135c93_caseD_47;
LAB_00135cc9:
        pcVar3 = "PADLOCK - Input data should be aligned";
      }
    }
    break;
  case 0x1e:
    pcVar3 = "AES - Invalid key length";
    break;
  case 0x20:
    pcVar3 = "AES - Invalid data input length";
    break;
  case 0x22:
switchD_001358da_caseD_22:
    snprintf(buf,local_58,"CAMELLIA - Invalid key length");
switchD_00135a6a_caseD_5:
    switch(uVar5) {
    case 5:
      goto switchD_001358da_caseD_3;
    case 6:
    case 8:
    case 10:
    case 0xc:
    case 0xe:
    case 0x10:
    case 0x11:
    case 0x13:
      goto switchD_00135c93_caseD_47;
    case 7:
      goto switchD_001358da_caseD_5;
    case 9:
      goto switchD_001358da_caseD_7;
    case 0xb:
      goto switchD_00135e2c_caseD_b;
    case 0xd:
      goto switchD_001358da_caseD_b;
    case 0xf:
      goto switchD_001358da_caseD_d;
    case 0x12:
      goto switchD_001358da_caseD_10;
    case 0x14:
      goto switchD_001358da_caseD_12;
    default:
      if (uVar5 != 0x28) {
        if (uVar5 != 0x26) goto switchD_00135c93_caseD_47;
        goto switchD_001358da_caseD_24;
      }
      goto switchD_00135b07_caseD_28;
    }
  case 0x24:
switchD_001358da_caseD_24:
    snprintf(buf,local_58,"CAMELLIA - Invalid data input length");
switchD_00135ad4_caseD_3:
    switch(uVar5) {
    case 5:
switchD_001358da_caseD_3:
      pcVar3 = "HMAC_DRBG - Input too large (Entropy + additional)";
      break;
    case 6:
    case 8:
    case 10:
    case 0xc:
    case 0xe:
    case 0x10:
    case 0x11:
    case 0x13:
      goto switchD_00135c93_caseD_47;
    case 7:
switchD_001358da_caseD_5:
      pcVar3 = "HMAC_DRBG - Read/write error in file";
      break;
    case 9:
switchD_001358da_caseD_7:
      pcVar3 = "HMAC_DRBG - The entropy source failed";
      break;
    case 0xb:
      goto switchD_00135e2c_caseD_b;
    case 0xd:
switchD_001358da_caseD_b:
      pcVar3 = "CCM - Bad input parameters to function";
      break;
    case 0xf:
switchD_001358da_caseD_d:
      pcVar3 = "CCM - Authenticated decryption failed";
      break;
    case 0x12:
switchD_001358da_caseD_10:
      pcVar3 = "GCM - Authenticated decryption failed";
      break;
    case 0x14:
switchD_001358da_caseD_12:
      pcVar3 = "GCM - Bad input parameters to function";
      break;
    default:
switchD_00135e2c_default:
      if (uVar5 != 0x28) goto switchD_00135c93_caseD_47;
      goto switchD_00135b07_caseD_28;
    }
    break;
  case 0x28:
    snprintf(buf,local_58,"BASE64 - Output buffer too small");
    switch(uVar6 >> 1 | (uint)((uVar6 & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_001358da_caseD_0;
    case 1:
      goto switchD_001358da_caseD_2;
    case 2:
      goto switchD_001358da_caseD_4;
    case 3:
      goto switchD_001358da_caseD_6;
    case 4:
      goto switchD_001358da_caseD_8;
    case 5:
      goto switchD_001358da_caseD_a;
    case 6:
      goto switchD_001358da_caseD_c;
    case 7:
      goto switchD_001358da_caseD_e;
    default:
      goto switchD_00135c93_caseD_47;
    case 10:
      goto switchD_001358da_caseD_14;
    case 0xb:
      goto switchD_001358da_caseD_16;
    case 0x15:
      goto switchD_001358da_caseD_2a;
    }
  case 0x2a:
switchD_001358da_caseD_2a:
    pcVar3 = "BASE64 - Invalid character in input";
    break;
  case 0x30:
    pcVar3 = "DES - The data input has an invalid length";
    break;
  case 0x32:
    pcVar3 = "CTR_DRBG - The entropy source failed";
    break;
  case 0x34:
    pcVar3 = "CTR_DRBG - Too many random requested in single call";
    break;
  case 0x36:
    pcVar3 = "CTR_DRBG - Input too large (Entropy + additional)";
    break;
  case 0x38:
    pcVar3 = "CTR_DRBG - Read/write error in file";
    break;
  case 0x3a:
    pcVar3 = "ENTROPY - Critical entropy source failure";
    break;
  case 0x3b:
    pcVar3 = "ENTROPY - No strong sources have been added to poll";
    break;
  case 0x3c:
    pcVar3 = "ENTROPY - No more sources can be added";
    break;
  case 0x3d:
    pcVar3 = "ENTROPY - Read/write error in file";
    break;
  case 0x3e:
    pcVar3 = "ENTROPY - No sources have been added to poll";
    break;
  case 0x40:
    pcVar3 = "NET - Failed to open a socket";
    break;
  default:
    switch(uVar5) {
    case 0x60:
      pcVar3 = "ASN1 - Out of data when parsing an ASN1 data structure";
      break;
    default:
      goto switchD_001358da_caseD_9;
    case 0x62:
      pcVar3 = "ASN1 - ASN1 tag was of an unexpected value";
      break;
    case 100:
      pcVar3 = "ASN1 - Error when trying to determine the length or invalid length";
      break;
    case 0x66:
      pcVar3 = "ASN1 - Actual length differs from expected length";
      break;
    case 0x68:
      pcVar3 = "ASN1 - Data is invalid. (not used)";
      break;
    case 0x6a:
      pcVar3 = "ASN1 - Memory allocation failed";
      break;
    case 0x6c:
      pcVar3 = "ASN1 - Buffer too small when writing ASN.1 data structure";
    }
  }
  snprintf(buf,local_58,pcVar3);
switchD_00135c93_caseD_47:
  if (*buf != '\0') {
    return;
  }
  snprintf(buf,local_58,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar5);
  return;
}

Assistant:

void mbedtls_strerror( int ret, char *buf, size_t buflen )
{
    size_t len;
    int use_ret;

    if( buflen == 0 )
        return;

    memset( buf, 0x00, buflen );

    if( ret < 0 )
        ret = -ret;

    if( ret & 0xFF80 )
    {
        use_ret = ret & 0xFF80;

        // High level error codes
        //
        // BEGIN generated code
#if defined(MBEDTLS_CIPHER_C)
        if( use_ret == -(MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "CIPHER - The selected feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_INVALID_PADDING) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Input data contains invalid padding and is rejected" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Decryption of block requires a full block" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_AUTH_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Authentication failed (for AEAD modes)" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_INVALID_CONTEXT) )
            mbedtls_snprintf( buf, buflen, "CIPHER - The context is invalid, eg because it was free()ed" );
#endif /* MBEDTLS_CIPHER_C */

#if defined(MBEDTLS_DHM_C)
        if( use_ret == -(MBEDTLS_ERR_DHM_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "DHM - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_DHM_READ_PARAMS_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Reading of the DHM parameters failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_MAKE_PARAMS_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Making of the DHM parameters failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_READ_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Reading of the public values failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_MAKE_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Making of the public value failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_CALC_SECRET_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Calculation of the DHM secret failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "DHM - The ASN.1 data is not formatted correctly" );
        if( use_ret == -(MBEDTLS_ERR_DHM_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Allocation of memory failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "DHM - Read/write of file failed" );
#endif /* MBEDTLS_DHM_C */

#if defined(MBEDTLS_ECP_C)
        if( use_ret == -(MBEDTLS_ERR_ECP_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "ECP - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL) )
            mbedtls_snprintf( buf, buflen, "ECP - The buffer is too small to write to" );
        if( use_ret == -(MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "ECP - Requested curve not available" );
        if( use_ret == -(MBEDTLS_ERR_ECP_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - The signature is not valid" );
        if( use_ret == -(MBEDTLS_ERR_ECP_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_RANDOM_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - Generation of random value, such as (ephemeral) key, failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_INVALID_KEY) )
            mbedtls_snprintf( buf, buflen, "ECP - Invalid private or public key" );
        if( use_ret == -(MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "ECP - Signature is valid but shorter than the user-supplied length" );
#endif /* MBEDTLS_ECP_C */

#if defined(MBEDTLS_MD_C)
        if( use_ret == -(MBEDTLS_ERR_MD_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "MD - The selected feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_MD_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "MD - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_MD_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "MD - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_MD_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "MD - Opening or reading of file failed" );
#endif /* MBEDTLS_MD_C */

#if defined(MBEDTLS_PEM_PARSE_C) || defined(MBEDTLS_PEM_WRITE_C)
        if( use_ret == -(MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) )
            mbedtls_snprintf( buf, buflen, "PEM - No PEM header or footer found" );
        if( use_ret == -(MBEDTLS_ERR_PEM_INVALID_DATA) )
            mbedtls_snprintf( buf, buflen, "PEM - PEM string is not as expected" );
        if( use_ret == -(MBEDTLS_ERR_PEM_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "PEM - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_PEM_INVALID_ENC_IV) )
            mbedtls_snprintf( buf, buflen, "PEM - RSA IV is not in hex-format" );
        if( use_ret == -(MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG) )
            mbedtls_snprintf( buf, buflen, "PEM - Unsupported key encryption algorithm" );
        if( use_ret == -(MBEDTLS_ERR_PEM_PASSWORD_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "PEM - Private key password can't be empty" );
        if( use_ret == -(MBEDTLS_ERR_PEM_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PEM - Given private key password does not allow for correct decryption" );
        if( use_ret == -(MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PEM - Unavailable feature, e.g. hashing/encryption combination" );
        if( use_ret == -(MBEDTLS_ERR_PEM_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PEM - Bad input parameters to function" );
#endif /* MBEDTLS_PEM_PARSE_C || MBEDTLS_PEM_WRITE_C */

#if defined(MBEDTLS_PK_C)
        if( use_ret == -(MBEDTLS_ERR_PK_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "PK - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_PK_TYPE_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - Type mismatch, eg attempt to encrypt with an ECDSA key" );
        if( use_ret == -(MBEDTLS_ERR_PK_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PK - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PK_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "PK - Read/write of file failed" );
        if( use_ret == -(MBEDTLS_ERR_PK_KEY_INVALID_VERSION) )
            mbedtls_snprintf( buf, buflen, "PK - Unsupported key version" );
        if( use_ret == -(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PK - Invalid key tag or value" );
        if( use_ret == -(MBEDTLS_ERR_PK_UNKNOWN_PK_ALG) )
            mbedtls_snprintf( buf, buflen, "PK - Key algorithm is unsupported (only RSA and EC are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_PASSWORD_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "PK - Private key password can't be empty" );
        if( use_ret == -(MBEDTLS_ERR_PK_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - Given private key password does not allow for correct decryption" );
        if( use_ret == -(MBEDTLS_ERR_PK_INVALID_PUBKEY) )
            mbedtls_snprintf( buf, buflen, "PK - The pubkey tag or value is invalid (only RSA and EC are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_INVALID_ALG) )
            mbedtls_snprintf( buf, buflen, "PK - The algorithm tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE) )
            mbedtls_snprintf( buf, buflen, "PK - Elliptic curve is unsupported (only NIST curves are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PK - Unavailable feature, e.g. RSA disabled for RSA key" );
        if( use_ret == -(MBEDTLS_ERR_PK_SIG_LEN_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - The signature is valid but its length is less than expected" );
#endif /* MBEDTLS_PK_C */

#if defined(MBEDTLS_PKCS12_C)
        if( use_ret == -(MBEDTLS_ERR_PKCS12_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Feature not available, e.g. unsupported encryption scheme" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_PBE_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - PBE ASN.1 data not as expected" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Given private key password does not allow for correct decryption" );
#endif /* MBEDTLS_PKCS12_C */

#if defined(MBEDTLS_PKCS5_C)
        if( use_ret == -(MBEDTLS_ERR_PKCS5_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Unexpected ASN.1 data" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Requested encryption or digest alg not available" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Given private key password does not allow for correct decryption" );
#endif /* MBEDTLS_PKCS5_C */

#if defined(MBEDTLS_RSA_C)
        if( use_ret == -(MBEDTLS_ERR_RSA_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "RSA - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_RSA_INVALID_PADDING) )
            mbedtls_snprintf( buf, buflen, "RSA - Input data contains invalid padding and is rejected" );
        if( use_ret == -(MBEDTLS_ERR_RSA_KEY_GEN_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - Something failed during generation of a key" );
        if( use_ret == -(MBEDTLS_ERR_RSA_KEY_CHECK_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - Key failed to pass the library's validity check" );
        if( use_ret == -(MBEDTLS_ERR_RSA_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The public key operation failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_PRIVATE_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The private key operation failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The PKCS#1 verification failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE) )
            mbedtls_snprintf( buf, buflen, "RSA - The output buffer for decryption is not large enough" );
        if( use_ret == -(MBEDTLS_ERR_RSA_RNG_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The random generator failed to generate non-zeros" );
#endif /* MBEDTLS_RSA_C */

#if defined(MBEDTLS_SSL_TLS_C)
        if( use_ret == -(MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "SSL - The requested feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "SSL - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_SSL_INVALID_MAC) )
            mbedtls_snprintf( buf, buflen, "SSL - Verification of the message MAC failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_INVALID_RECORD) )
            mbedtls_snprintf( buf, buflen, "SSL - An invalid SSL record was received" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CONN_EOF) )
            mbedtls_snprintf( buf, buflen, "SSL - The connection indicated an EOF" );
        if( use_ret == -(MBEDTLS_ERR_SSL_UNKNOWN_CIPHER) )
            mbedtls_snprintf( buf, buflen, "SSL - An unknown cipher was received" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NO_CIPHER_CHOSEN) )
            mbedtls_snprintf( buf, buflen, "SSL - The server has no ciphersuites in common with the client" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NO_RNG) )
            mbedtls_snprintf( buf, buflen, "SSL - No RNG was provided to the SSL module" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE) )
            mbedtls_snprintf( buf, buflen, "SSL - No client certification received from the client, but required by the authentication mode" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CERTIFICATE_TOO_LARGE) )
            mbedtls_snprintf( buf, buflen, "SSL - Our own certificate(s) is/are too large to send in an SSL message" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CERTIFICATE_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - The own certificate is not set, but needed by the server" );
        if( use_ret == -(MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - The own private key or pre-shared key is not set, but needed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CA_CHAIN_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - No CA Chain is set, but required to operate" );
        if( use_ret == -(MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE) )
            mbedtls_snprintf( buf, buflen, "SSL - An unexpected message was received from our peer" );
        if( use_ret == -(MBEDTLS_ERR_SSL_FATAL_ALERT_MESSAGE) )
        {
            mbedtls_snprintf( buf, buflen, "SSL - A fatal alert message was received from our peer" );
            return;
        }
        if( use_ret == -(MBEDTLS_ERR_SSL_PEER_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "SSL - Verification of our peer failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_PEER_CLOSE_NOTIFY) )
            mbedtls_snprintf( buf, buflen, "SSL - The peer notified us that the connection is going to be closed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ClientHello handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ServerHello handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the Certificate handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the CertificateRequest handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ServerKeyExchange handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO_DONE) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ServerHelloDone handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ClientKeyExchange handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_RP) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Read Public" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_CS) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Calculate Secret" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the CertificateVerify handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CHANGE_CIPHER_SPEC) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ChangeCipherSpec handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_FINISHED) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the Finished handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "SSL - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "SSL - Hardware acceleration function returned with error" );
        if( use_ret == -(MBEDTLS_ERR_SSL_HW_ACCEL_FALLTHROUGH) )
            mbedtls_snprintf( buf, buflen, "SSL - Hardware acceleration function skipped / left alone data" );
        if( use_ret == -(MBEDTLS_ERR_SSL_COMPRESSION_FAILED) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the compression / decompression failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_PROTOCOL_VERSION) )
            mbedtls_snprintf( buf, buflen, "SSL - Handshake protocol not within min/max boundaries" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_NEW_SESSION_TICKET) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the NewSessionTicket handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_SESSION_TICKET_EXPIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - Session ticket has expired" );
        if( use_ret == -(MBEDTLS_ERR_SSL_PK_TYPE_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "SSL - Public key type mismatch (eg, asked for RSA key exchange and presented EC key)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY) )
            mbedtls_snprintf( buf, buflen, "SSL - Unknown identity received (eg, PSK identity)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_INTERNAL_ERROR) )
            mbedtls_snprintf( buf, buflen, "SSL - Internal error (eg, unexpected failure in lower-level module)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_COUNTER_WRAPPING) )
            mbedtls_snprintf( buf, buflen, "SSL - A counter would wrap (eg, too many messages exchanged)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO) )
            mbedtls_snprintf( buf, buflen, "SSL - Unexpected message at ServerHello in renegotiation" );
        if( use_ret == -(MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - DTLS client must retry for hello verification" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL) )
            mbedtls_snprintf( buf, buflen, "SSL - A buffer is too small to receive or write a message" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NO_USABLE_CIPHERSUITE) )
            mbedtls_snprintf( buf, buflen, "SSL - None of the common ciphersuites is usable (eg, no suitable certificate, see debug messages)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_WANT_READ) )
            mbedtls_snprintf( buf, buflen, "SSL - Connection requires a read call" );
        if( use_ret == -(MBEDTLS_ERR_SSL_WANT_WRITE) )
            mbedtls_snprintf( buf, buflen, "SSL - Connection requires a write call" );
        if( use_ret == -(MBEDTLS_ERR_SSL_TIMEOUT) )
            mbedtls_snprintf( buf, buflen, "SSL - The operation timed out" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CLIENT_RECONNECT) )
            mbedtls_snprintf( buf, buflen, "SSL - The client initiated a reconnect from the same port" );
        if( use_ret == -(MBEDTLS_ERR_SSL_UNEXPECTED_RECORD) )
            mbedtls_snprintf( buf, buflen, "SSL - Record header looks valid but is not expected" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NON_FATAL) )
            mbedtls_snprintf( buf, buflen, "SSL - The alert message received indicates a non-fatal error" );
        if( use_ret == -(MBEDTLS_ERR_SSL_INVALID_VERIFY_HASH) )
            mbedtls_snprintf( buf, buflen, "SSL - Couldn't set the hash for verifying CertificateVerify" );
#endif /* MBEDTLS_SSL_TLS_C */

#if defined(MBEDTLS_X509_USE_C) || defined(MBEDTLS_X509_CREATE_C)
        if( use_ret == -(MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "X509 - Unavailable feature, e.g. RSA hashing/encryption combination" );
        if( use_ret == -(MBEDTLS_ERR_X509_UNKNOWN_OID) )
            mbedtls_snprintf( buf, buflen, "X509 - Requested OID is unknown" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "X509 - The CRT/CRL/CSR format is invalid, e.g. different type expected" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_VERSION) )
            mbedtls_snprintf( buf, buflen, "X509 - The CRT/CRL/CSR version element is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_SERIAL) )
            mbedtls_snprintf( buf, buflen, "X509 - The serial tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_ALG) )
            mbedtls_snprintf( buf, buflen, "X509 - The algorithm tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_NAME) )
            mbedtls_snprintf( buf, buflen, "X509 - The name tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_DATE) )
            mbedtls_snprintf( buf, buflen, "X509 - The date tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_SIGNATURE) )
            mbedtls_snprintf( buf, buflen, "X509 - The signature tag or value invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_EXTENSIONS) )
            mbedtls_snprintf( buf, buflen, "X509 - The extension tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_UNKNOWN_VERSION) )
            mbedtls_snprintf( buf, buflen, "X509 - CRT/CRL/CSR has an unsupported version number" );
        if( use_ret == -(MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG) )
            mbedtls_snprintf( buf, buflen, "X509 - Signature algorithm (oid) is unsupported" );
        if( use_ret == -(MBEDTLS_ERR_X509_SIG_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "X509 - Signature algorithms do not match. (see \\c ::mbedtls_x509_crt sig_oid)" );
        if( use_ret == -(MBEDTLS_ERR_X509_CERT_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "X509 - Certificate verification failed, e.g. CRL, CA or signature check failed" );
        if( use_ret == -(MBEDTLS_ERR_X509_CERT_UNKNOWN_FORMAT) )
            mbedtls_snprintf( buf, buflen, "X509 - Format not recognized as DER or PEM" );
        if( use_ret == -(MBEDTLS_ERR_X509_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "X509 - Input invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "X509 - Allocation of memory failed" );
        if( use_ret == -(MBEDTLS_ERR_X509_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "X509 - Read/write of file failed" );
        if( use_ret == -(MBEDTLS_ERR_X509_BUFFER_TOO_SMALL) )
            mbedtls_snprintf( buf, buflen, "X509 - Destination buffer is too small" );
#endif /* MBEDTLS_X509_USE_C || MBEDTLS_X509_CREATE_C */
        // END generated code

        if( strlen( buf ) == 0 )
            mbedtls_snprintf( buf, buflen, "UNKNOWN ERROR CODE (%04X)", use_ret );
    }

    use_ret = ret & ~0xFF80;

    if( use_ret == 0 )
        return;

    // If high level code is present, make a concatenation between both
    // error strings.
    //
    len = strlen( buf );

    if( len > 0 )
    {
        if( buflen - len < 5 )
            return;

        mbedtls_snprintf( buf + len, buflen - len, " : " );

        buf += len + 3;
        buflen -= len + 3;
    }

    // Low level error codes
    //
    // BEGIN generated code
#if defined(MBEDTLS_AES_C)
    if( use_ret == -(MBEDTLS_ERR_AES_INVALID_KEY_LENGTH) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid key length" );
    if( use_ret == -(MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid data input length" );
#endif /* MBEDTLS_AES_C */

#if defined(MBEDTLS_ASN1_PARSE_C)
    if( use_ret == -(MBEDTLS_ERR_ASN1_OUT_OF_DATA) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Out of data when parsing an ASN1 data structure" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) )
        mbedtls_snprintf( buf, buflen, "ASN1 - ASN1 tag was of an unexpected value" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_INVALID_LENGTH) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Error when trying to determine the length or invalid length" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_LENGTH_MISMATCH) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Actual length differs from expected length" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_INVALID_DATA) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Data is invalid. (not used)" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_ALLOC_FAILED) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Memory allocation failed" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_BUF_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Buffer too small when writing ASN.1 data structure" );
#endif /* MBEDTLS_ASN1_PARSE_C */

#if defined(MBEDTLS_BASE64_C)
    if( use_ret == -(MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "BASE64 - Output buffer too small" );
    if( use_ret == -(MBEDTLS_ERR_BASE64_INVALID_CHARACTER) )
        mbedtls_snprintf( buf, buflen, "BASE64 - Invalid character in input" );
#endif /* MBEDTLS_BASE64_C */

#if defined(MBEDTLS_BIGNUM_C)
    if( use_ret == -(MBEDTLS_ERR_MPI_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - An error occurred while reading from or writing to a file" );
    if( use_ret == -(MBEDTLS_ERR_MPI_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_MPI_INVALID_CHARACTER) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - There is an invalid character in the digit string" );
    if( use_ret == -(MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The buffer is too small to write to" );
    if( use_ret == -(MBEDTLS_ERR_MPI_NEGATIVE_VALUE) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input arguments are negative or result in illegal output" );
    if( use_ret == -(MBEDTLS_ERR_MPI_DIVISION_BY_ZERO) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input argument for division is zero, which is not allowed" );
    if( use_ret == -(MBEDTLS_ERR_MPI_NOT_ACCEPTABLE) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input arguments are not acceptable" );
    if( use_ret == -(MBEDTLS_ERR_MPI_ALLOC_FAILED) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - Memory allocation failed" );
#endif /* MBEDTLS_BIGNUM_C */

#if defined(MBEDTLS_BLOWFISH_C)
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_INVALID_KEY_LENGTH) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Invalid key length" );
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Invalid data input length" );
#endif /* MBEDTLS_BLOWFISH_C */

#if defined(MBEDTLS_CAMELLIA_C)
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_INVALID_KEY_LENGTH) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Invalid key length" );
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Invalid data input length" );
#endif /* MBEDTLS_CAMELLIA_C */

#if defined(MBEDTLS_CCM_C)
    if( use_ret == -(MBEDTLS_ERR_CCM_BAD_INPUT) )
        mbedtls_snprintf( buf, buflen, "CCM - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_CCM_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "CCM - Authenticated decryption failed" );
#endif /* MBEDTLS_CCM_C */

#if defined(MBEDTLS_CTR_DRBG_C)
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - The entropy source failed" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_REQUEST_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - Too many random requested in single call" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - Input too large (Entropy + additional)" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - Read/write error in file" );
#endif /* MBEDTLS_CTR_DRBG_C */

#if defined(MBEDTLS_DES_C)
    if( use_ret == -(MBEDTLS_ERR_DES_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "DES - The data input has an invalid length" );
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_ENTROPY_C)
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - Critical entropy source failure" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_MAX_SOURCES) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No more sources can be added" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No sources have been added to poll" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No strong sources have been added to poll" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - Read/write error in file" );
#endif /* MBEDTLS_ENTROPY_C */

#if defined(MBEDTLS_GCM_C)
    if( use_ret == -(MBEDTLS_ERR_GCM_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "GCM - Authenticated decryption failed" );
    if( use_ret == -(MBEDTLS_ERR_GCM_BAD_INPUT) )
        mbedtls_snprintf( buf, buflen, "GCM - Bad input parameters to function" );
#endif /* MBEDTLS_GCM_C */

#if defined(MBEDTLS_HMAC_DRBG_C)
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_REQUEST_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Too many random requested in single call" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Input too large (Entropy + additional)" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Read/write error in file" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - The entropy source failed" );
#endif /* MBEDTLS_HMAC_DRBG_C */

#if defined(MBEDTLS_NET_C)
    if( use_ret == -(MBEDTLS_ERR_NET_SOCKET_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Failed to open a socket" );
    if( use_ret == -(MBEDTLS_ERR_NET_CONNECT_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - The connection to the given server / port failed" );
    if( use_ret == -(MBEDTLS_ERR_NET_BIND_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Binding of the socket failed" );
    if( use_ret == -(MBEDTLS_ERR_NET_LISTEN_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Could not listen on the socket" );
    if( use_ret == -(MBEDTLS_ERR_NET_ACCEPT_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Could not accept the incoming connection" );
    if( use_ret == -(MBEDTLS_ERR_NET_RECV_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Reading information from the socket failed" );
    if( use_ret == -(MBEDTLS_ERR_NET_SEND_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Sending information through the socket failed" );
    if( use_ret == -(MBEDTLS_ERR_NET_CONN_RESET) )
        mbedtls_snprintf( buf, buflen, "NET - Connection was reset by peer" );
    if( use_ret == -(MBEDTLS_ERR_NET_UNKNOWN_HOST) )
        mbedtls_snprintf( buf, buflen, "NET - Failed to get an IP address for the given hostname" );
    if( use_ret == -(MBEDTLS_ERR_NET_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "NET - Buffer is too small to hold the data" );
    if( use_ret == -(MBEDTLS_ERR_NET_INVALID_CONTEXT) )
        mbedtls_snprintf( buf, buflen, "NET - The context is invalid, eg because it was free()ed" );
#endif /* MBEDTLS_NET_C */

#if defined(MBEDTLS_OID_C)
    if( use_ret == -(MBEDTLS_ERR_OID_NOT_FOUND) )
        mbedtls_snprintf( buf, buflen, "OID - OID is not found" );
    if( use_ret == -(MBEDTLS_ERR_OID_BUF_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "OID - output buffer is too small" );
#endif /* MBEDTLS_OID_C */

#if defined(MBEDTLS_PADLOCK_C)
    if( use_ret == -(MBEDTLS_ERR_PADLOCK_DATA_MISALIGNED) )
        mbedtls_snprintf( buf, buflen, "PADLOCK - Input data should be aligned" );
#endif /* MBEDTLS_PADLOCK_C */

#if defined(MBEDTLS_THREADING_C)
    if( use_ret == -(MBEDTLS_ERR_THREADING_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "THREADING - The selected feature is not available" );
    if( use_ret == -(MBEDTLS_ERR_THREADING_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "THREADING - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_THREADING_MUTEX_ERROR) )
        mbedtls_snprintf( buf, buflen, "THREADING - Locking / unlocking / free failed with error code" );
#endif /* MBEDTLS_THREADING_C */

#if defined(MBEDTLS_XTEA_C)
    if( use_ret == -(MBEDTLS_ERR_XTEA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "XTEA - The data input has an invalid length" );
#endif /* MBEDTLS_XTEA_C */
    // END generated code

    if( strlen( buf ) != 0 )
        return;

    mbedtls_snprintf( buf, buflen, "UNKNOWN ERROR CODE (%04X)", use_ret );
}